

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Scene **ppSVar5;
  Scene **ppSVar6;
  Scene **ppSVar7;
  Scene **ppSVar8;
  Primitive *pPVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined6 uVar42;
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  int iVar64;
  undefined4 uVar65;
  ulong uVar66;
  long lVar67;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long extraout_RAX_02;
  RayK<4> *pRVar68;
  long extraout_RAX_03;
  long extraout_RAX_04;
  long extraout_RAX_05;
  long extraout_RAX_06;
  RTCFilterFunctionN p_Var69;
  ulong uVar70;
  RTCIntersectArguments *pRVar71;
  ulong uVar72;
  long lVar73;
  byte bVar74;
  ulong uVar75;
  int iVar76;
  undefined4 uVar77;
  long lVar78;
  RTCFilterFunctionNArguments *pRVar79;
  byte bVar80;
  long lVar81;
  uint uVar82;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  uint uVar86;
  short sVar87;
  undefined2 uVar129;
  float fVar88;
  float fVar89;
  float fVar130;
  float fVar132;
  __m128 a_1;
  float fVar131;
  float fVar133;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar104 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  vfloat4 a;
  undefined1 auVar134 [16];
  undefined1 auVar137 [16];
  undefined1 auVar140 [16];
  float fVar164;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar165;
  float fVar180;
  float fVar181;
  vfloat4 v;
  float fVar182;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar183;
  float fVar200;
  float fVar201;
  vfloat4 v_1;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar202;
  float fVar212;
  float fVar213;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar236;
  float fVar237;
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar238;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar239;
  float fVar246;
  float fVar247;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar248;
  float fVar260;
  float fVar261;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar262;
  float fVar270;
  float fVar271;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar272;
  float fVar280;
  float fVar282;
  undefined1 auVar273 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar281;
  float fVar283;
  float fVar284;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar285;
  float fVar286;
  float fVar293;
  float fVar295;
  undefined1 auVar287 [16];
  undefined1 auVar290 [16];
  float fVar294;
  float fVar296;
  float fVar297;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar298;
  float fVar306;
  float fVar307;
  float fVar308;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar309;
  float fVar310;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar315 [16];
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar324 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar336 [16];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx u_outer1;
  vfloatx u_outer0;
  vboolx valid;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  bool local_6a9;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  undefined8 local_558;
  undefined8 uStack_550;
  RTCFilterFunctionNArguments *local_540;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  undefined8 uStack_4d0;
  RTCRayQueryContext *local_4c8;
  RayK<4> *local_4c0;
  RTCHitN *local_4b8;
  uint local_4b0;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined8 *local_3f8;
  ulong local_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined1 local_348 [16];
  float local_338 [4];
  float local_328 [4];
  Primitive *local_318;
  ulong local_310;
  uint local_308;
  uint uStack_304;
  uint uStack_300;
  uint uStack_2fc;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  uint local_248;
  uint uStack_244;
  uint uStack_240;
  uint uStack_23c;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint local_f8 [4];
  float afStack_e8 [4];
  float local_d8 [42];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 uVar128;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar335 [16];
  undefined1 auVar337 [16];
  
  PVar18 = prim[1];
  uVar66 = (ulong)(byte)PVar18;
  lVar67 = uVar66 * 0x25;
  pPVar9 = prim + lVar67 + 6;
  fVar181 = *(float *)(pPVar9 + 0xc);
  fVar183 = (*(float *)(ray + k * 4) - *(float *)pPVar9) * fVar181;
  fVar200 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar9 + 4)) * fVar181;
  fVar201 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar9 + 8)) * fVar181;
  fVar165 = *(float *)(ray + k * 4 + 0x40) * fVar181;
  fVar180 = *(float *)(ray + k * 4 + 0x50) * fVar181;
  fVar181 = *(float *)(ray + k * 4 + 0x60) * fVar181;
  uVar77 = *(undefined4 *)(prim + uVar66 * 4 + 6);
  uVar128 = (undefined1)((uint)uVar77 >> 0x18);
  uVar129 = CONCAT11(uVar128,uVar128);
  uVar128 = (undefined1)((uint)uVar77 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar129,uVar128),CONCAT14(uVar128,uVar77));
  uVar128 = (undefined1)((uint)uVar77 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar128),uVar128);
  sVar87 = CONCAT11((char)uVar77,(char)uVar77);
  uVar75 = CONCAT62(uVar42,sVar87);
  auVar277._8_4_ = 0;
  auVar277._0_8_ = uVar75;
  auVar277._12_2_ = uVar129;
  auVar277._14_2_ = uVar129;
  uVar129 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar167._12_4_ = auVar277._12_4_;
  auVar167._8_2_ = 0;
  auVar167._0_8_ = uVar75;
  auVar167._10_2_ = uVar129;
  auVar90._10_6_ = auVar167._10_6_;
  auVar90._8_2_ = uVar129;
  auVar90._0_8_ = uVar75;
  uVar129 = (undefined2)uVar42;
  auVar43._4_8_ = auVar90._8_8_;
  auVar43._2_2_ = uVar129;
  auVar43._0_2_ = uVar129;
  fVar88 = (float)((int)sVar87 >> 8);
  fVar130 = (float)(auVar43._0_4_ >> 0x18);
  fVar132 = (float)(auVar90._8_4_ >> 0x18);
  uVar77 = *(undefined4 *)(prim + uVar66 * 5 + 6);
  uVar128 = (undefined1)((uint)uVar77 >> 0x18);
  uVar129 = CONCAT11(uVar128,uVar128);
  uVar128 = (undefined1)((uint)uVar77 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar129,uVar128),CONCAT14(uVar128,uVar77));
  uVar128 = (undefined1)((uint)uVar77 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar128),uVar128);
  sVar87 = CONCAT11((char)uVar77,(char)uVar77);
  uVar75 = CONCAT62(uVar42,sVar87);
  auVar136._8_4_ = 0;
  auVar136._0_8_ = uVar75;
  auVar136._12_2_ = uVar129;
  auVar136._14_2_ = uVar129;
  uVar129 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar135._12_4_ = auVar136._12_4_;
  auVar135._8_2_ = 0;
  auVar135._0_8_ = uVar75;
  auVar135._10_2_ = uVar129;
  auVar134._10_6_ = auVar135._10_6_;
  auVar134._8_2_ = uVar129;
  auVar134._0_8_ = uVar75;
  uVar129 = (undefined2)uVar42;
  auVar44._4_8_ = auVar134._8_8_;
  auVar44._2_2_ = uVar129;
  auVar44._0_2_ = uVar129;
  fVar202 = (float)((int)sVar87 >> 8);
  fVar212 = (float)(auVar44._0_4_ >> 0x18);
  fVar213 = (float)(auVar134._8_4_ >> 0x18);
  uVar77 = *(undefined4 *)(prim + uVar66 * 6 + 6);
  uVar128 = (undefined1)((uint)uVar77 >> 0x18);
  uVar129 = CONCAT11(uVar128,uVar128);
  uVar128 = (undefined1)((uint)uVar77 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar129,uVar128),CONCAT14(uVar128,uVar77));
  uVar128 = (undefined1)((uint)uVar77 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar128),uVar128);
  sVar87 = CONCAT11((char)uVar77,(char)uVar77);
  uVar75 = CONCAT62(uVar42,sVar87);
  auVar139._8_4_ = 0;
  auVar139._0_8_ = uVar75;
  auVar139._12_2_ = uVar129;
  auVar139._14_2_ = uVar129;
  uVar129 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar138._12_4_ = auVar139._12_4_;
  auVar138._8_2_ = 0;
  auVar138._0_8_ = uVar75;
  auVar138._10_2_ = uVar129;
  auVar137._10_6_ = auVar138._10_6_;
  auVar137._8_2_ = uVar129;
  auVar137._0_8_ = uVar75;
  uVar129 = (undefined2)uVar42;
  auVar45._4_8_ = auVar137._8_8_;
  auVar45._2_2_ = uVar129;
  auVar45._0_2_ = uVar129;
  fVar262 = (float)((int)sVar87 >> 8);
  fVar270 = (float)(auVar45._0_4_ >> 0x18);
  fVar271 = (float)(auVar137._8_4_ >> 0x18);
  uVar77 = *(undefined4 *)(prim + uVar66 * 0xf + 6);
  uVar128 = (undefined1)((uint)uVar77 >> 0x18);
  uVar129 = CONCAT11(uVar128,uVar128);
  uVar128 = (undefined1)((uint)uVar77 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar129,uVar128),CONCAT14(uVar128,uVar77));
  uVar128 = (undefined1)((uint)uVar77 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar128),uVar128);
  sVar87 = CONCAT11((char)uVar77,(char)uVar77);
  uVar75 = CONCAT62(uVar42,sVar87);
  auVar142._8_4_ = 0;
  auVar142._0_8_ = uVar75;
  auVar142._12_2_ = uVar129;
  auVar142._14_2_ = uVar129;
  uVar129 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar141._12_4_ = auVar142._12_4_;
  auVar141._8_2_ = 0;
  auVar141._0_8_ = uVar75;
  auVar141._10_2_ = uVar129;
  auVar140._10_6_ = auVar141._10_6_;
  auVar140._8_2_ = uVar129;
  auVar140._0_8_ = uVar75;
  uVar129 = (undefined2)uVar42;
  auVar46._4_8_ = auVar140._8_8_;
  auVar46._2_2_ = uVar129;
  auVar46._0_2_ = uVar129;
  fVar89 = (float)((int)sVar87 >> 8);
  fVar131 = (float)(auVar46._0_4_ >> 0x18);
  fVar133 = (float)(auVar140._8_4_ >> 0x18);
  uVar77 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar128 = (undefined1)((uint)uVar77 >> 0x18);
  uVar129 = CONCAT11(uVar128,uVar128);
  uVar128 = (undefined1)((uint)uVar77 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar129,uVar128),CONCAT14(uVar128,uVar77));
  uVar128 = (undefined1)((uint)uVar77 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar128),uVar128);
  sVar87 = CONCAT11((char)uVar77,(char)uVar77);
  uVar75 = CONCAT62(uVar42,sVar87);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar75;
  auVar217._12_2_ = uVar129;
  auVar217._14_2_ = uVar129;
  uVar129 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar75;
  auVar216._10_2_ = uVar129;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar129;
  auVar215._0_8_ = uVar75;
  uVar129 = (undefined2)uVar42;
  auVar47._4_8_ = auVar215._8_8_;
  auVar47._2_2_ = uVar129;
  auVar47._0_2_ = uVar129;
  fVar248 = (float)((int)sVar87 >> 8);
  fVar260 = (float)(auVar47._0_4_ >> 0x18);
  fVar261 = (float)(auVar215._8_4_ >> 0x18);
  uVar77 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar66 + 6);
  uVar128 = (undefined1)((uint)uVar77 >> 0x18);
  uVar129 = CONCAT11(uVar128,uVar128);
  uVar128 = (undefined1)((uint)uVar77 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar129,uVar128),CONCAT14(uVar128,uVar77));
  uVar128 = (undefined1)((uint)uVar77 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar128),uVar128);
  sVar87 = CONCAT11((char)uVar77,(char)uVar77);
  uVar75 = CONCAT62(uVar42,sVar87);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar75;
  auVar220._12_2_ = uVar129;
  auVar220._14_2_ = uVar129;
  uVar129 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar75;
  auVar219._10_2_ = uVar129;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar129;
  auVar218._0_8_ = uVar75;
  uVar129 = (undefined2)uVar42;
  auVar48._4_8_ = auVar218._8_8_;
  auVar48._2_2_ = uVar129;
  auVar48._0_2_ = uVar129;
  fVar272 = (float)((int)sVar87 >> 8);
  fVar280 = (float)(auVar48._0_4_ >> 0x18);
  fVar282 = (float)(auVar218._8_4_ >> 0x18);
  uVar77 = *(undefined4 *)(prim + uVar66 * 0x1a + 6);
  uVar128 = (undefined1)((uint)uVar77 >> 0x18);
  uVar129 = CONCAT11(uVar128,uVar128);
  uVar128 = (undefined1)((uint)uVar77 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar129,uVar128),CONCAT14(uVar128,uVar77));
  uVar128 = (undefined1)((uint)uVar77 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar128),uVar128);
  sVar87 = CONCAT11((char)uVar77,(char)uVar77);
  uVar75 = CONCAT62(uVar42,sVar87);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar75;
  auVar223._12_2_ = uVar129;
  auVar223._14_2_ = uVar129;
  uVar129 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar75;
  auVar222._10_2_ = uVar129;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar129;
  auVar221._0_8_ = uVar75;
  uVar129 = (undefined2)uVar42;
  auVar49._4_8_ = auVar221._8_8_;
  auVar49._2_2_ = uVar129;
  auVar49._0_2_ = uVar129;
  fVar322 = (float)((int)sVar87 >> 8);
  fVar325 = (float)(auVar49._0_4_ >> 0x18);
  fVar327 = (float)(auVar221._8_4_ >> 0x18);
  uVar77 = *(undefined4 *)(prim + uVar66 * 0x1b + 6);
  uVar128 = (undefined1)((uint)uVar77 >> 0x18);
  uVar129 = CONCAT11(uVar128,uVar128);
  uVar128 = (undefined1)((uint)uVar77 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar129,uVar128),CONCAT14(uVar128,uVar77));
  uVar128 = (undefined1)((uint)uVar77 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar128),uVar128);
  sVar87 = CONCAT11((char)uVar77,(char)uVar77);
  uVar75 = CONCAT62(uVar42,sVar87);
  auVar226._8_4_ = 0;
  auVar226._0_8_ = uVar75;
  auVar226._12_2_ = uVar129;
  auVar226._14_2_ = uVar129;
  uVar129 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar225._12_4_ = auVar226._12_4_;
  auVar225._8_2_ = 0;
  auVar225._0_8_ = uVar75;
  auVar225._10_2_ = uVar129;
  auVar224._10_6_ = auVar225._10_6_;
  auVar224._8_2_ = uVar129;
  auVar224._0_8_ = uVar75;
  uVar129 = (undefined2)uVar42;
  auVar50._4_8_ = auVar224._8_8_;
  auVar50._2_2_ = uVar129;
  auVar50._0_2_ = uVar129;
  fVar285 = (float)((int)sVar87 >> 8);
  fVar293 = (float)(auVar50._0_4_ >> 0x18);
  fVar295 = (float)(auVar224._8_4_ >> 0x18);
  uVar77 = *(undefined4 *)(prim + uVar66 * 0x1c + 6);
  uVar128 = (undefined1)((uint)uVar77 >> 0x18);
  uVar129 = CONCAT11(uVar128,uVar128);
  uVar128 = (undefined1)((uint)uVar77 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar129,uVar128),CONCAT14(uVar128,uVar77));
  uVar128 = (undefined1)((uint)uVar77 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar128),uVar128);
  sVar87 = CONCAT11((char)uVar77,(char)uVar77);
  uVar75 = CONCAT62(uVar42,sVar87);
  auVar229._8_4_ = 0;
  auVar229._0_8_ = uVar75;
  auVar229._12_2_ = uVar129;
  auVar229._14_2_ = uVar129;
  uVar129 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar228._12_4_ = auVar229._12_4_;
  auVar228._8_2_ = 0;
  auVar228._0_8_ = uVar75;
  auVar228._10_2_ = uVar129;
  auVar227._10_6_ = auVar228._10_6_;
  auVar227._8_2_ = uVar129;
  auVar227._0_8_ = uVar75;
  uVar129 = (undefined2)uVar42;
  auVar51._4_8_ = auVar227._8_8_;
  auVar51._2_2_ = uVar129;
  auVar51._0_2_ = uVar129;
  fVar239 = (float)((int)sVar87 >> 8);
  fVar246 = (float)(auVar51._0_4_ >> 0x18);
  fVar247 = (float)(auVar227._8_4_ >> 0x18);
  fVar309 = fVar165 * fVar88 + fVar180 * fVar202 + fVar181 * fVar262;
  fVar316 = fVar165 * fVar130 + fVar180 * fVar212 + fVar181 * fVar270;
  fVar318 = fVar165 * fVar132 + fVar180 * fVar213 + fVar181 * fVar271;
  fVar320 = fVar165 * (float)(auVar167._12_4_ >> 0x18) +
            fVar180 * (float)(auVar135._12_4_ >> 0x18) + fVar181 * (float)(auVar138._12_4_ >> 0x18);
  fVar298 = fVar165 * fVar89 + fVar180 * fVar248 + fVar181 * fVar272;
  fVar306 = fVar165 * fVar131 + fVar180 * fVar260 + fVar181 * fVar280;
  fVar307 = fVar165 * fVar133 + fVar180 * fVar261 + fVar181 * fVar282;
  fVar308 = fVar165 * (float)(auVar141._12_4_ >> 0x18) +
            fVar180 * (float)(auVar216._12_4_ >> 0x18) + fVar181 * (float)(auVar219._12_4_ >> 0x18);
  fVar214 = fVar165 * fVar322 + fVar180 * fVar285 + fVar181 * fVar239;
  fVar236 = fVar165 * fVar325 + fVar180 * fVar293 + fVar181 * fVar246;
  fVar237 = fVar165 * fVar327 + fVar180 * fVar295 + fVar181 * fVar247;
  fVar165 = fVar165 * (float)(auVar222._12_4_ >> 0x18) +
            fVar180 * (float)(auVar225._12_4_ >> 0x18) + fVar181 * (float)(auVar228._12_4_ >> 0x18);
  fVar262 = fVar88 * fVar183 + fVar202 * fVar200 + fVar262 * fVar201;
  fVar270 = fVar130 * fVar183 + fVar212 * fVar200 + fVar270 * fVar201;
  fVar271 = fVar132 * fVar183 + fVar213 * fVar200 + fVar271 * fVar201;
  fVar164 = (float)(auVar167._12_4_ >> 0x18) * fVar183 +
            (float)(auVar135._12_4_ >> 0x18) * fVar200 + (float)(auVar138._12_4_ >> 0x18) * fVar201;
  fVar272 = fVar89 * fVar183 + fVar248 * fVar200 + fVar272 * fVar201;
  fVar280 = fVar131 * fVar183 + fVar260 * fVar200 + fVar280 * fVar201;
  fVar282 = fVar133 * fVar183 + fVar261 * fVar200 + fVar282 * fVar201;
  fVar182 = (float)(auVar141._12_4_ >> 0x18) * fVar183 +
            (float)(auVar216._12_4_ >> 0x18) * fVar200 + (float)(auVar219._12_4_ >> 0x18) * fVar201;
  fVar322 = fVar183 * fVar322 + fVar200 * fVar285 + fVar201 * fVar239;
  fVar293 = fVar183 * fVar325 + fVar200 * fVar293 + fVar201 * fVar246;
  fVar295 = fVar183 * fVar327 + fVar200 * fVar295 + fVar201 * fVar247;
  fVar325 = fVar183 * (float)(auVar222._12_4_ >> 0x18) +
            fVar200 * (float)(auVar225._12_4_ >> 0x18) + fVar201 * (float)(auVar228._12_4_ >> 0x18);
  fVar181 = (float)DAT_01ff1d40;
  fVar88 = DAT_01ff1d40._4_4_;
  fVar89 = DAT_01ff1d40._8_4_;
  fVar130 = DAT_01ff1d40._12_4_;
  uVar82 = -(uint)(fVar181 <= ABS(fVar309));
  uVar83 = -(uint)(fVar88 <= ABS(fVar316));
  uVar84 = -(uint)(fVar89 <= ABS(fVar318));
  uVar85 = -(uint)(fVar130 <= ABS(fVar320));
  auVar311._0_4_ = (uint)fVar309 & uVar82;
  auVar311._4_4_ = (uint)fVar316 & uVar83;
  auVar311._8_4_ = (uint)fVar318 & uVar84;
  auVar311._12_4_ = (uint)fVar320 & uVar85;
  auVar184._0_4_ = ~uVar82 & (uint)fVar181;
  auVar184._4_4_ = ~uVar83 & (uint)fVar88;
  auVar184._8_4_ = ~uVar84 & (uint)fVar89;
  auVar184._12_4_ = ~uVar85 & (uint)fVar130;
  auVar184 = auVar184 | auVar311;
  uVar82 = -(uint)(fVar181 <= ABS(fVar298));
  uVar83 = -(uint)(fVar88 <= ABS(fVar306));
  uVar84 = -(uint)(fVar89 <= ABS(fVar307));
  uVar85 = -(uint)(fVar130 <= ABS(fVar308));
  auVar299._0_4_ = (uint)fVar298 & uVar82;
  auVar299._4_4_ = (uint)fVar306 & uVar83;
  auVar299._8_4_ = (uint)fVar307 & uVar84;
  auVar299._12_4_ = (uint)fVar308 & uVar85;
  auVar240._0_4_ = ~uVar82 & (uint)fVar181;
  auVar240._4_4_ = ~uVar83 & (uint)fVar88;
  auVar240._8_4_ = ~uVar84 & (uint)fVar89;
  auVar240._12_4_ = ~uVar85 & (uint)fVar130;
  auVar240 = auVar240 | auVar299;
  uVar82 = -(uint)(fVar181 <= ABS(fVar214));
  uVar83 = -(uint)(fVar88 <= ABS(fVar236));
  uVar84 = -(uint)(fVar89 <= ABS(fVar237));
  uVar85 = -(uint)(fVar130 <= ABS(fVar165));
  auVar230._0_4_ = (uint)fVar214 & uVar82;
  auVar230._4_4_ = (uint)fVar236 & uVar83;
  auVar230._8_4_ = (uint)fVar237 & uVar84;
  auVar230._12_4_ = (uint)fVar165 & uVar85;
  auVar249._0_4_ = ~uVar82 & (uint)fVar181;
  auVar249._4_4_ = ~uVar83 & (uint)fVar88;
  auVar249._8_4_ = ~uVar84 & (uint)fVar89;
  auVar249._12_4_ = ~uVar85 & (uint)fVar130;
  auVar249 = auVar249 | auVar230;
  auVar90 = rcpps(_DAT_01ff1d40,auVar184);
  fVar181 = auVar90._0_4_;
  fVar130 = auVar90._4_4_;
  fVar202 = auVar90._8_4_;
  fVar248 = auVar90._12_4_;
  fVar181 = (1.0 - auVar184._0_4_ * fVar181) * fVar181 + fVar181;
  fVar130 = (1.0 - auVar184._4_4_ * fVar130) * fVar130 + fVar130;
  fVar202 = (1.0 - auVar184._8_4_ * fVar202) * fVar202 + fVar202;
  fVar248 = (1.0 - auVar184._12_4_ * fVar248) * fVar248 + fVar248;
  auVar90 = rcpps(auVar90,auVar240);
  fVar88 = auVar90._0_4_;
  fVar131 = auVar90._4_4_;
  fVar212 = auVar90._8_4_;
  fVar260 = auVar90._12_4_;
  fVar88 = (1.0 - auVar240._0_4_ * fVar88) * fVar88 + fVar88;
  fVar131 = (1.0 - auVar240._4_4_ * fVar131) * fVar131 + fVar131;
  fVar212 = (1.0 - auVar240._8_4_ * fVar212) * fVar212 + fVar212;
  fVar260 = (1.0 - auVar240._12_4_ * fVar260) * fVar260 + fVar260;
  auVar90 = rcpps(auVar90,auVar249);
  fVar89 = auVar90._0_4_;
  fVar132 = auVar90._4_4_;
  fVar213 = auVar90._8_4_;
  fVar261 = auVar90._12_4_;
  fVar89 = (1.0 - auVar249._0_4_ * fVar89) * fVar89 + fVar89;
  fVar132 = (1.0 - auVar249._4_4_ * fVar132) * fVar132 + fVar132;
  fVar213 = (1.0 - auVar249._8_4_ * fVar213) * fVar213 + fVar213;
  fVar261 = (1.0 - auVar249._12_4_ * fVar261) * fVar261 + fVar261;
  fVar285 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar67 + 0x16)) *
            *(float *)(prim + lVar67 + 0x1a);
  uVar75 = *(ulong *)(prim + uVar66 * 7 + 6);
  uVar129 = (undefined2)(uVar75 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar75;
  auVar91._12_2_ = uVar129;
  auVar91._14_2_ = uVar129;
  uVar129 = (undefined2)(uVar75 >> 0x20);
  auVar333._12_4_ = auVar91._12_4_;
  auVar333._8_2_ = 0;
  auVar333._0_8_ = uVar75;
  auVar333._10_2_ = uVar129;
  auVar256._10_6_ = auVar333._10_6_;
  auVar256._8_2_ = uVar129;
  auVar256._0_8_ = uVar75;
  uVar129 = (undefined2)(uVar75 >> 0x10);
  auVar52._4_8_ = auVar256._8_8_;
  auVar52._2_2_ = uVar129;
  auVar52._0_2_ = uVar129;
  fVar133 = (float)(auVar52._0_4_ >> 0x10);
  fVar214 = (float)(auVar256._8_4_ >> 0x10);
  uVar70 = *(ulong *)(prim + uVar66 * 0xb + 6);
  uVar129 = (undefined2)(uVar70 >> 0x30);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar70;
  auVar187._12_2_ = uVar129;
  auVar187._14_2_ = uVar129;
  uVar129 = (undefined2)(uVar70 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar70;
  auVar186._10_2_ = uVar129;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar129;
  auVar185._0_8_ = uVar70;
  uVar129 = (undefined2)(uVar70 >> 0x10);
  auVar53._4_8_ = auVar185._8_8_;
  auVar53._2_2_ = uVar129;
  auVar53._0_2_ = uVar129;
  uVar10 = *(ulong *)(prim + uVar66 * 9 + 6);
  uVar129 = (undefined2)(uVar10 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar10;
  auVar94._12_2_ = uVar129;
  auVar94._14_2_ = uVar129;
  uVar129 = (undefined2)(uVar10 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar10;
  auVar93._10_2_ = uVar129;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar129;
  auVar92._0_8_ = uVar10;
  uVar129 = (undefined2)(uVar10 >> 0x10);
  auVar54._4_8_ = auVar92._8_8_;
  auVar54._2_2_ = uVar129;
  auVar54._0_2_ = uVar129;
  fVar165 = (float)(auVar54._0_4_ >> 0x10);
  fVar236 = (float)(auVar92._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar66 * 0xd + 6);
  uVar129 = (undefined2)(uVar11 >> 0x30);
  auVar252._8_4_ = 0;
  auVar252._0_8_ = uVar11;
  auVar252._12_2_ = uVar129;
  auVar252._14_2_ = uVar129;
  uVar129 = (undefined2)(uVar11 >> 0x20);
  auVar251._12_4_ = auVar252._12_4_;
  auVar251._8_2_ = 0;
  auVar251._0_8_ = uVar11;
  auVar251._10_2_ = uVar129;
  auVar250._10_6_ = auVar251._10_6_;
  auVar250._8_2_ = uVar129;
  auVar250._0_8_ = uVar11;
  uVar129 = (undefined2)(uVar11 >> 0x10);
  auVar55._4_8_ = auVar250._8_8_;
  auVar55._2_2_ = uVar129;
  auVar55._0_2_ = uVar129;
  uVar12 = *(ulong *)(prim + uVar66 * 0x12 + 6);
  uVar129 = (undefined2)(uVar12 >> 0x30);
  auVar97._8_4_ = 0;
  auVar97._0_8_ = uVar12;
  auVar97._12_2_ = uVar129;
  auVar97._14_2_ = uVar129;
  uVar129 = (undefined2)(uVar12 >> 0x20);
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._8_2_ = 0;
  auVar96._0_8_ = uVar12;
  auVar96._10_2_ = uVar129;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._8_2_ = uVar129;
  auVar95._0_8_ = uVar12;
  uVar129 = (undefined2)(uVar12 >> 0x10);
  auVar56._4_8_ = auVar95._8_8_;
  auVar56._2_2_ = uVar129;
  auVar56._0_2_ = uVar129;
  fVar180 = (float)(auVar56._0_4_ >> 0x10);
  fVar237 = (float)(auVar95._8_4_ >> 0x10);
  uVar72 = (ulong)(uint)((int)(uVar66 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar66 * 2 + uVar72 + 6);
  uVar129 = (undefined2)(uVar13 >> 0x30);
  auVar275._8_4_ = 0;
  auVar275._0_8_ = uVar13;
  auVar275._12_2_ = uVar129;
  auVar275._14_2_ = uVar129;
  uVar129 = (undefined2)(uVar13 >> 0x20);
  auVar274._12_4_ = auVar275._12_4_;
  auVar274._8_2_ = 0;
  auVar274._0_8_ = uVar13;
  auVar274._10_2_ = uVar129;
  auVar273._10_6_ = auVar274._10_6_;
  auVar273._8_2_ = uVar129;
  auVar273._0_8_ = uVar13;
  uVar129 = (undefined2)(uVar13 >> 0x10);
  auVar57._4_8_ = auVar273._8_8_;
  auVar57._2_2_ = uVar129;
  auVar57._0_2_ = uVar129;
  uVar72 = *(ulong *)(prim + uVar72 + 6);
  uVar129 = (undefined2)(uVar72 >> 0x30);
  auVar100._8_4_ = 0;
  auVar100._0_8_ = uVar72;
  auVar100._12_2_ = uVar129;
  auVar100._14_2_ = uVar129;
  uVar129 = (undefined2)(uVar72 >> 0x20);
  auVar99._12_4_ = auVar100._12_4_;
  auVar99._8_2_ = 0;
  auVar99._0_8_ = uVar72;
  auVar99._10_2_ = uVar129;
  auVar98._10_6_ = auVar99._10_6_;
  auVar98._8_2_ = uVar129;
  auVar98._0_8_ = uVar72;
  uVar129 = (undefined2)(uVar72 >> 0x10);
  auVar58._4_8_ = auVar98._8_8_;
  auVar58._2_2_ = uVar129;
  auVar58._0_2_ = uVar129;
  fVar183 = (float)(auVar58._0_4_ >> 0x10);
  fVar239 = (float)(auVar98._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar66 * 0x18 + 6);
  uVar129 = (undefined2)(uVar14 >> 0x30);
  auVar289._8_4_ = 0;
  auVar289._0_8_ = uVar14;
  auVar289._12_2_ = uVar129;
  auVar289._14_2_ = uVar129;
  uVar129 = (undefined2)(uVar14 >> 0x20);
  auVar288._12_4_ = auVar289._12_4_;
  auVar288._8_2_ = 0;
  auVar288._0_8_ = uVar14;
  auVar288._10_2_ = uVar129;
  auVar287._10_6_ = auVar288._10_6_;
  auVar287._8_2_ = uVar129;
  auVar287._0_8_ = uVar14;
  uVar129 = (undefined2)(uVar14 >> 0x10);
  auVar59._4_8_ = auVar287._8_8_;
  auVar59._2_2_ = uVar129;
  auVar59._0_2_ = uVar129;
  uVar15 = *(ulong *)(prim + uVar66 * 0x1d + 6);
  uVar129 = (undefined2)(uVar15 >> 0x30);
  auVar103._8_4_ = 0;
  auVar103._0_8_ = uVar15;
  auVar103._12_2_ = uVar129;
  auVar103._14_2_ = uVar129;
  uVar129 = (undefined2)(uVar15 >> 0x20);
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._8_2_ = 0;
  auVar102._0_8_ = uVar15;
  auVar102._10_2_ = uVar129;
  auVar101._10_6_ = auVar102._10_6_;
  auVar101._8_2_ = uVar129;
  auVar101._0_8_ = uVar15;
  uVar129 = (undefined2)(uVar15 >> 0x10);
  auVar60._4_8_ = auVar101._8_8_;
  auVar60._2_2_ = uVar129;
  auVar60._0_2_ = uVar129;
  fVar200 = (float)(auVar60._0_4_ >> 0x10);
  fVar246 = (float)(auVar101._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar66 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar129 = (undefined2)(uVar16 >> 0x30);
  auVar302._8_4_ = 0;
  auVar302._0_8_ = uVar16;
  auVar302._12_2_ = uVar129;
  auVar302._14_2_ = uVar129;
  uVar129 = (undefined2)(uVar16 >> 0x20);
  auVar301._12_4_ = auVar302._12_4_;
  auVar301._8_2_ = 0;
  auVar301._0_8_ = uVar16;
  auVar301._10_2_ = uVar129;
  auVar300._10_6_ = auVar301._10_6_;
  auVar300._8_2_ = uVar129;
  auVar300._0_8_ = uVar16;
  uVar129 = (undefined2)(uVar16 >> 0x10);
  auVar61._4_8_ = auVar300._8_8_;
  auVar61._2_2_ = uVar129;
  auVar61._0_2_ = uVar129;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar66) + 6);
  uVar129 = (undefined2)(uVar17 >> 0x30);
  auVar106._8_4_ = 0;
  auVar106._0_8_ = uVar17;
  auVar106._12_2_ = uVar129;
  auVar106._14_2_ = uVar129;
  uVar129 = (undefined2)(uVar17 >> 0x20);
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._8_2_ = 0;
  auVar105._0_8_ = uVar17;
  auVar105._10_2_ = uVar129;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._8_2_ = uVar129;
  auVar104._0_8_ = uVar17;
  uVar129 = (undefined2)(uVar17 >> 0x10);
  auVar62._4_8_ = auVar104._8_8_;
  auVar62._2_2_ = uVar129;
  auVar62._0_2_ = uVar129;
  fVar201 = (float)(auVar62._0_4_ >> 0x10);
  fVar247 = (float)(auVar104._8_4_ >> 0x10);
  uVar66 = *(ulong *)(prim + uVar66 * 0x23 + 6);
  uVar129 = (undefined2)(uVar66 >> 0x30);
  auVar314._8_4_ = 0;
  auVar314._0_8_ = uVar66;
  auVar314._12_2_ = uVar129;
  auVar314._14_2_ = uVar129;
  uVar129 = (undefined2)(uVar66 >> 0x20);
  auVar313._12_4_ = auVar314._12_4_;
  auVar313._8_2_ = 0;
  auVar313._0_8_ = uVar66;
  auVar313._10_2_ = uVar129;
  auVar312._10_6_ = auVar313._10_6_;
  auVar312._8_2_ = uVar129;
  auVar312._0_8_ = uVar66;
  uVar129 = (undefined2)(uVar66 >> 0x10);
  auVar63._4_8_ = auVar312._8_8_;
  auVar63._2_2_ = uVar129;
  auVar63._0_2_ = uVar129;
  auVar188._0_8_ =
       CONCAT44(((((float)(auVar53._0_4_ >> 0x10) - fVar133) * fVar285 + fVar133) - fVar270) *
                fVar130,((((float)(int)(short)uVar70 - (float)(int)(short)uVar75) * fVar285 +
                         (float)(int)(short)uVar75) - fVar262) * fVar181);
  auVar188._8_4_ =
       ((((float)(auVar185._8_4_ >> 0x10) - fVar214) * fVar285 + fVar214) - fVar271) * fVar202;
  auVar188._12_4_ =
       ((((float)(auVar186._12_4_ >> 0x10) - (float)(auVar333._12_4_ >> 0x10)) * fVar285 +
        (float)(auVar333._12_4_ >> 0x10)) - fVar164) * fVar248;
  auVar253._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar285 +
        (float)(int)(short)uVar10) - fVar262) * fVar181;
  auVar253._4_4_ =
       ((((float)(auVar55._0_4_ >> 0x10) - fVar165) * fVar285 + fVar165) - fVar270) * fVar130;
  auVar253._8_4_ =
       ((((float)(auVar250._8_4_ >> 0x10) - fVar236) * fVar285 + fVar236) - fVar271) * fVar202;
  auVar253._12_4_ =
       ((((float)(auVar251._12_4_ >> 0x10) - (float)(auVar93._12_4_ >> 0x10)) * fVar285 +
        (float)(auVar93._12_4_ >> 0x10)) - fVar164) * fVar248;
  auVar276._0_8_ =
       CONCAT44(((((float)(auVar57._0_4_ >> 0x10) - fVar180) * fVar285 + fVar180) - fVar280) *
                fVar131,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar285 +
                         (float)(int)(short)uVar12) - fVar272) * fVar88);
  auVar276._8_4_ =
       ((((float)(auVar273._8_4_ >> 0x10) - fVar237) * fVar285 + fVar237) - fVar282) * fVar212;
  auVar276._12_4_ =
       ((((float)(auVar274._12_4_ >> 0x10) - (float)(auVar96._12_4_ >> 0x10)) * fVar285 +
        (float)(auVar96._12_4_ >> 0x10)) - fVar182) * fVar260;
  auVar290._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar72) * fVar285 +
        (float)(int)(short)uVar72) - fVar272) * fVar88;
  auVar290._4_4_ =
       ((((float)(auVar59._0_4_ >> 0x10) - fVar183) * fVar285 + fVar183) - fVar280) * fVar131;
  auVar290._8_4_ =
       ((((float)(auVar287._8_4_ >> 0x10) - fVar239) * fVar285 + fVar239) - fVar282) * fVar212;
  auVar290._12_4_ =
       ((((float)(auVar288._12_4_ >> 0x10) - (float)(auVar99._12_4_ >> 0x10)) * fVar285 +
        (float)(auVar99._12_4_ >> 0x10)) - fVar182) * fVar260;
  uVar77 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar303._0_8_ =
       CONCAT44(((((float)(auVar61._0_4_ >> 0x10) - fVar200) * fVar285 + fVar200) - fVar293) *
                fVar132,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar285 +
                         (float)(int)(short)uVar15) - fVar322) * fVar89);
  auVar303._8_4_ =
       ((((float)(auVar300._8_4_ >> 0x10) - fVar246) * fVar285 + fVar246) - fVar295) * fVar213;
  auVar303._12_4_ =
       ((((float)(auVar301._12_4_ >> 0x10) - (float)(auVar102._12_4_ >> 0x10)) * fVar285 +
        (float)(auVar102._12_4_ >> 0x10)) - fVar325) * fVar261;
  auVar315._0_4_ =
       ((((float)(int)(short)uVar66 - (float)(int)(short)uVar17) * fVar285 +
        (float)(int)(short)uVar17) - fVar322) * fVar89;
  auVar315._4_4_ =
       ((((float)(auVar63._0_4_ >> 0x10) - fVar201) * fVar285 + fVar201) - fVar293) * fVar132;
  auVar315._8_4_ =
       ((((float)(auVar312._8_4_ >> 0x10) - fVar247) * fVar285 + fVar247) - fVar295) * fVar213;
  auVar315._12_4_ =
       ((((float)(auVar313._12_4_ >> 0x10) - (float)(auVar105._12_4_ >> 0x10)) * fVar285 +
        (float)(auVar105._12_4_ >> 0x10)) - fVar325) * fVar261;
  auVar166._8_4_ = auVar188._8_4_;
  auVar166._0_8_ = auVar188._0_8_;
  auVar166._12_4_ = auVar188._12_4_;
  auVar167 = minps(auVar166,auVar253);
  auVar143._8_4_ = auVar276._8_4_;
  auVar143._0_8_ = auVar276._0_8_;
  auVar143._12_4_ = auVar276._12_4_;
  auVar90 = minps(auVar143,auVar290);
  auVar167 = maxps(auVar167,auVar90);
  auVar144._8_4_ = auVar303._8_4_;
  auVar144._0_8_ = auVar303._0_8_;
  auVar144._12_4_ = auVar303._12_4_;
  auVar90 = minps(auVar144,auVar315);
  auVar107._4_4_ = uVar77;
  auVar107._0_4_ = uVar77;
  auVar107._8_4_ = uVar77;
  auVar107._12_4_ = uVar77;
  auVar90 = maxps(auVar90,auVar107);
  auVar90 = maxps(auVar167,auVar90);
  auVar167 = maxps(auVar188,auVar253);
  auVar277 = maxps(auVar276,auVar290);
  auVar167 = minps(auVar167,auVar277);
  auVar277 = maxps(auVar303,auVar315);
  uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar108._4_4_ = uVar77;
  auVar108._0_4_ = uVar77;
  auVar108._8_4_ = uVar77;
  auVar108._12_4_ = uVar77;
  auVar277 = minps(auVar277,auVar108);
  local_208 = auVar90._0_4_ * 0.99999964;
  fStack_204 = auVar90._4_4_ * 0.99999964;
  fStack_200 = auVar90._8_4_ * 0.99999964;
  fStack_1fc = auVar90._12_4_ * 0.99999964;
  auVar90 = minps(auVar167,auVar277);
  uVar82 = (uint)(byte)PVar18;
  auVar109._0_4_ = -(uint)(local_208 <= auVar90._0_4_ * 1.0000004 && uVar82 != 0);
  auVar109._4_4_ = -(uint)(fStack_204 <= auVar90._4_4_ * 1.0000004 && 1 < uVar82);
  auVar109._8_4_ = -(uint)(fStack_200 <= auVar90._8_4_ * 1.0000004 && 2 < uVar82);
  auVar109._12_4_ = -(uint)(fStack_1fc <= auVar90._12_4_ * 1.0000004 && 3 < uVar82);
  uVar82 = movmskps(uVar82,auVar109);
  local_6a9 = uVar82 != 0;
  if (uVar82 == 0) {
    return local_6a9;
  }
  uVar82 = uVar82 & 0xff;
  local_1c8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1c8._12_4_ = 0;
  local_3f8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_318 = prim;
LAB_00bc08e4:
  local_310 = (ulong)uVar82;
  lVar67 = 0;
  if (local_310 != 0) {
    for (; (uVar82 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
    }
  }
  uVar82 = *(uint *)(local_318 + 2);
  uVar75 = (ulong)uVar82;
  uVar83 = *(uint *)(local_318 + lVar67 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[uVar75].ptr;
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                           (ulong)uVar83 *
                           pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar181 = pGVar19->fnumTimeSegments;
  fVar88 = (pGVar19->time_range).lower;
  fVar89 = ((*(float *)(ray + k * 4 + 0x70) - fVar88) / ((pGVar19->time_range).upper - fVar88)) *
           fVar181;
  fVar88 = floorf(fVar89);
  fVar181 = fVar181 + -1.0;
  if (fVar181 <= fVar88) {
    fVar88 = fVar181;
  }
  fVar181 = 0.0;
  if (0.0 <= fVar88) {
    fVar181 = fVar88;
  }
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar73 = (long)(int)fVar181 * 0x38;
  lVar67 = *(long *)(_Var20 + 0x10 + lVar73);
  lVar78 = lVar67 * uVar70;
  pRVar79 = (RTCFilterFunctionNArguments *)(uVar70 + 3);
  lVar81 = *(long *)(_Var20 + 0x38 + lVar73);
  lVar21 = *(long *)(_Var20 + 0x48 + lVar73);
  pfVar1 = (float *)(lVar81 + uVar70 * lVar21);
  pfVar2 = (float *)(lVar81 + (uVar70 + 1) * lVar21);
  pfVar3 = (float *)(lVar81 + (uVar70 + 2) * lVar21);
  fVar89 = fVar89 - fVar181;
  fVar165 = 1.0 - fVar89;
  pfVar4 = (float *)(lVar81 + lVar21 * (long)pRVar79);
  pRVar71 = *(RTCIntersectArguments **)(_Var20 + lVar73);
  ppSVar5 = (Scene **)((long)&pRVar71->flags + lVar78);
  ppSVar6 = (Scene **)((long)&pRVar71->flags + lVar67 * (uVar70 + 1));
  ppSVar7 = (Scene **)((long)&pRVar71->flags + lVar67 * (uVar70 + 2));
  fVar200 = *(float *)ppSVar5 * fVar165 + *pfVar1 * fVar89;
  fVar201 = *(float *)((long)ppSVar5 + 4) * fVar165 + pfVar1[1] * fVar89;
  fVar202 = *(float *)(ppSVar5 + 1) * fVar165 + pfVar1[2] * fVar89;
  fVar132 = *(float *)ppSVar6 * fVar165 + *pfVar2 * fVar89;
  fVar213 = *(float *)((long)ppSVar6 + 4) * fVar165 + pfVar2[1] * fVar89;
  fVar214 = *(float *)(ppSVar6 + 1) * fVar165 + pfVar2[2] * fVar89;
  local_4f8 = *(float *)ppSVar7 * fVar165 + *pfVar3 * fVar89;
  fStack_4f4 = *(float *)((long)ppSVar7 + 4) * fVar165 + pfVar3[1] * fVar89;
  fStack_4f0 = *(float *)(ppSVar7 + 1) * fVar165 + pfVar3[2] * fVar89;
  ppSVar8 = (Scene **)((long)&pRVar71->flags + lVar67 * (long)pRVar79);
  local_5d8._0_4_ = fVar165 * *(float *)ppSVar8 + fVar89 * *pfVar4;
  local_5d8._4_4_ = fVar165 * *(float *)((long)ppSVar8 + 4) + fVar89 * pfVar4[1];
  fStack_5d0 = fVar165 * *(float *)(ppSVar8 + 1) + fVar89 * pfVar4[2];
  fStack_11c = *(float *)(ray + k * 4 + 0x40);
  fVar181 = *(float *)(ray + k * 4 + 0x50);
  local_5b8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x60);
  local_3b8._4_4_ = fVar181;
  local_3b8._0_4_ = fStack_11c;
  fStack_3b0 = (float)local_5b8._4_4_;
  fStack_3ac = 0.0;
  fVar88 = fVar181 * fVar181;
  fVar130 = (float)local_5b8._4_4_ * (float)local_5b8._4_4_;
  fVar236 = fVar88 + fStack_11c * fStack_11c + fVar130;
  local_3d8._0_8_ = CONCAT44(fVar88 + fVar88 + 0.0,fVar236);
  local_3d8._8_4_ = fVar88 + fVar130 + fVar130;
  local_3d8._12_4_ = fVar88 + 0.0 + 0.0;
  auVar203._8_4_ = local_3d8._8_4_;
  auVar203._0_8_ = local_3d8._0_8_;
  auVar203._12_4_ = local_3d8._12_4_;
  auVar90 = rcpss(auVar203,local_3d8);
  local_3c8 = (2.0 - fVar236 * auVar90._0_4_) * auVar90._0_4_ *
              (((fVar202 + fVar214 + fStack_4f0 + fStack_5d0) * 0.25 -
               *(float *)(ray + k * 4 + 0x20)) * (float)local_5b8._4_4_ +
              ((fVar201 + fVar213 + fStack_4f4 + (float)local_5d8._4_4_) * 0.25 -
              *(float *)(ray + k * 4 + 0x10)) * fVar181 +
              ((fVar200 + fVar132 + local_4f8 + (float)local_5d8._0_4_) * 0.25 -
              *(float *)(ray + k * 4)) * fStack_11c);
  fStack_3c4 = local_3c8;
  fStack_3c0 = local_3c8;
  fStack_3bc = local_3c8;
  fVar88 = fStack_11c * local_3c8 + *(float *)(ray + k * 4);
  fVar131 = fVar181 * local_3c8 + *(float *)(ray + k * 4 + 0x10);
  fVar133 = (float)local_5b8._4_4_ * local_3c8 + *(float *)(ray + k * 4 + 0x20);
  fVar200 = fVar200 - fVar88;
  fVar201 = fVar201 - fVar131;
  fVar202 = fVar202 - fVar133;
  fVar212 = (*(float *)((long)ppSVar5 + 0xc) * fVar165 + pfVar1[3] * fVar89) - 0.0;
  local_4f8 = local_4f8 - fVar88;
  fStack_4f4 = fStack_4f4 - fVar131;
  fStack_4f0 = fStack_4f0 - fVar133;
  fStack_4ec = (*(float *)((long)ppSVar7 + 0xc) * fVar165 + pfVar3[3] * fVar89) - 0.0;
  fVar132 = fVar132 - fVar88;
  fVar213 = fVar213 - fVar131;
  fVar214 = fVar214 - fVar133;
  fVar183 = (*(float *)((long)ppSVar6 + 0xc) * fVar165 + pfVar2[3] * fVar89) - 0.0;
  local_5d8._0_4_ = (float)local_5d8._0_4_ - fVar88;
  local_5d8._4_4_ = (float)local_5d8._4_4_ - fVar131;
  fStack_5d0 = fStack_5d0 - fVar133;
  fStack_5cc = (fVar165 * *(float *)((long)ppSVar8 + 0xc) + fVar89 * pfVar4[3]) - 0.0;
  fVar88 = fVar181 * fVar181;
  fStack_11c = fStack_11c * fStack_11c;
  local_128 = fStack_11c + fVar88 + fVar130;
  fStack_124 = fStack_11c + fVar88 + fVar130;
  fStack_120 = fStack_11c + fVar88 + fVar130;
  fStack_11c = fStack_11c + fVar88 + fVar130;
  local_138 = local_4f8;
  fStack_134 = local_4f8;
  fStack_130 = local_4f8;
  fStack_12c = local_4f8;
  local_148 = fStack_4f4;
  fStack_144 = fStack_4f4;
  fStack_140 = fStack_4f4;
  fStack_13c = fStack_4f4;
  local_158 = fStack_4f0;
  fStack_154 = fStack_4f0;
  fStack_150 = fStack_4f0;
  fStack_14c = fStack_4f0;
  local_168 = fStack_4ec;
  fStack_164 = fStack_4ec;
  fStack_160 = fStack_4ec;
  fStack_15c = fStack_4ec;
  local_178 = (float)local_5d8._0_4_;
  fStack_174 = (float)local_5d8._0_4_;
  fStack_170 = (float)local_5d8._0_4_;
  fStack_16c = (float)local_5d8._0_4_;
  local_188 = (float)local_5d8._4_4_;
  fStack_184 = (float)local_5d8._4_4_;
  fStack_180 = (float)local_5d8._4_4_;
  fStack_17c = (float)local_5d8._4_4_;
  local_198 = fStack_5d0;
  fStack_194 = fStack_5d0;
  fStack_190 = fStack_5d0;
  fStack_18c = fStack_5d0;
  local_1a8 = fStack_5cc;
  fStack_1a4 = fStack_5cc;
  fStack_1a0 = fStack_5cc;
  fStack_19c = fStack_5cc;
  local_518 = *(float *)(ray + k * 4 + 0x40);
  local_5b8._0_4_ = local_5b8._4_4_;
  fStack_5b0 = (float)local_5b8._4_4_;
  fStack_5ac = (float)local_5b8._4_4_;
  local_2d8 = ABS(local_128);
  fStack_2d4 = ABS(fStack_124);
  fStack_2d0 = ABS(fStack_120);
  fStack_2cc = ABS(fStack_11c);
  fVar88 = *(float *)(ray + k * 4 + 0x30);
  local_348 = ZEXT416((uint)local_3c8);
  local_1b8 = fVar88 - local_3c8;
  fStack_1b4 = local_1b8;
  fStack_1b0 = local_1b8;
  fStack_1ac = local_1b8;
  local_3f0 = uVar75;
  local_2f8 = uVar82;
  uStack_2f4 = uVar82;
  uStack_2f0 = uVar82;
  uStack_2ec = uVar82;
  local_308 = uVar83;
  uStack_304 = uVar83;
  uStack_300 = uVar83;
  uStack_2fc = uVar83;
  uVar82 = 0;
  bVar80 = 0;
  lVar67 = 1;
  local_540 = (RTCFilterFunctionNArguments *)0x1;
  local_358._0_4_ = 0.0;
  local_358._4_4_ = 1.0;
  uStack_350._0_4_ = 0;
  uStack_350._4_4_ = 0;
  local_2c8 = fVar200;
  fStack_2c4 = fVar200;
  fStack_2c0 = fVar200;
  fStack_2bc = fVar200;
  local_1d8 = fVar201;
  fStack_1d4 = fVar201;
  fStack_1d0 = fVar201;
  fStack_1cc = fVar201;
  local_488 = fVar132;
  fStack_484 = fVar132;
  fStack_480 = fVar132;
  fStack_47c = fVar132;
  fVar89 = fVar132;
  fVar130 = fVar132;
  fVar131 = fVar132;
  fVar133 = fVar183;
  fVar165 = fVar183;
  fVar180 = fVar183;
  local_528 = fVar183;
  fStack_524 = fVar183;
  fStack_520 = fVar183;
  fStack_51c = fVar183;
  fStack_514 = local_518;
  fStack_510 = local_518;
  fStack_50c = local_518;
  local_4e8 = fVar132;
  fStack_4e4 = fVar213;
  fStack_4e0 = fVar214;
  fStack_4dc = fVar183;
  do {
    local_438 = local_358._4_4_ - (float)local_358;
    fStack_434 = local_438;
    fStack_430 = local_438;
    fStack_42c = local_438;
    local_448._4_4_ = (float)local_358;
    local_448._0_4_ = (float)local_358;
    fStack_440 = (float)local_358;
    fStack_43c = (float)local_358;
    fVar237 = local_438 * 0.0 + (float)local_358;
    fVar239 = local_438 * 0.33333334 + (float)local_358;
    fVar246 = local_438 * 0.6666667 + (float)local_358;
    fVar247 = local_438 * 1.0 + (float)local_358;
    fVar248 = 1.0 - fVar237;
    fVar260 = 1.0 - fVar239;
    fVar261 = 1.0 - fVar246;
    fVar262 = 1.0 - fVar247;
    fVar327 = fVar132 * fVar248 + local_138 * fVar237;
    fVar281 = fVar89 * fVar260 + fStack_134 * fVar239;
    fVar283 = fVar130 * fVar261 + fStack_130 * fVar246;
    fVar284 = fVar131 * fVar262 + fStack_12c * fVar247;
    fVar286 = fVar213 * fVar248 + local_148 * fVar237;
    fVar294 = fVar213 * fVar260 + fStack_144 * fVar239;
    fVar296 = fVar213 * fVar261 + fStack_140 * fVar246;
    fVar297 = fVar213 * fVar262 + fStack_13c * fVar247;
    fVar280 = fVar214 * fVar248 + local_158 * fVar237;
    fVar282 = fVar214 * fVar260 + fStack_154 * fVar239;
    fVar182 = fVar214 * fVar261 + fStack_150 * fVar246;
    fVar285 = fVar214 * fVar262 + fStack_14c * fVar247;
    fVar318 = fVar183 * fVar248 + local_168 * fVar237;
    fVar320 = fVar133 * fVar260 + fStack_164 * fVar239;
    fVar322 = fVar165 * fVar261 + fStack_160 * fVar246;
    fVar325 = fVar180 * fVar262 + fStack_15c * fVar247;
    fVar132 = (local_2c8 * fVar248 + fVar132 * fVar237) * fVar248 + fVar237 * fVar327;
    fVar89 = (fStack_2c4 * fVar260 + fVar89 * fVar239) * fVar260 + fVar239 * fVar281;
    fVar130 = (fStack_2c0 * fVar261 + fVar130 * fVar246) * fVar261 + fVar246 * fVar283;
    fVar131 = (fStack_2bc * fVar262 + fVar131 * fVar247) * fVar262 + fVar247 * fVar284;
    fVar270 = (local_1d8 * fVar248 + fVar213 * fVar237) * fVar248 + fVar237 * fVar286;
    fVar271 = (fStack_1d4 * fVar260 + fVar213 * fVar239) * fVar260 + fVar239 * fVar294;
    fVar164 = (fStack_1d0 * fVar261 + fVar213 * fVar246) * fVar261 + fVar246 * fVar296;
    fVar272 = (fStack_1cc * fVar262 + fVar213 * fVar247) * fVar262 + fVar247 * fVar297;
    fVar293 = (fVar202 * fVar248 + fVar214 * fVar237) * fVar248 + fVar237 * fVar280;
    fVar295 = (fVar202 * fVar260 + fVar214 * fVar239) * fVar260 + fVar239 * fVar282;
    fVar298 = (fVar202 * fVar261 + fVar214 * fVar246) * fVar261 + fVar246 * fVar182;
    fVar306 = (fVar202 * fVar262 + fVar214 * fVar247) * fVar262 + fVar247 * fVar285;
    fVar307 = (fVar212 * fVar248 + fVar183 * fVar237) * fVar248 + fVar237 * fVar318;
    fVar308 = (fVar212 * fVar260 + fVar133 * fVar239) * fVar260 + fVar239 * fVar320;
    fVar309 = (fVar212 * fVar261 + fVar165 * fVar246) * fVar261 + fVar246 * fVar322;
    fVar316 = (fVar212 * fVar262 + fVar180 * fVar247) * fVar262 + fVar247 * fVar325;
    fVar327 = fVar327 * fVar248 + (local_138 * fVar248 + local_178 * fVar237) * fVar237;
    fVar281 = fVar281 * fVar260 + (fStack_134 * fVar260 + fStack_174 * fVar239) * fVar239;
    fVar283 = fVar283 * fVar261 + (fStack_130 * fVar261 + fStack_170 * fVar246) * fVar246;
    fVar284 = fVar284 * fVar262 + (fStack_12c * fVar262 + fStack_16c * fVar247) * fVar247;
    fVar286 = fVar286 * fVar248 + (local_148 * fVar248 + local_188 * fVar237) * fVar237;
    fVar294 = fVar294 * fVar260 + (fStack_144 * fVar260 + fStack_184 * fVar239) * fVar239;
    fVar296 = fVar296 * fVar261 + (fStack_140 * fVar261 + fStack_180 * fVar246) * fVar246;
    fVar297 = fVar297 * fVar262 + (fStack_13c * fVar262 + fStack_17c * fVar247) * fVar247;
    fVar133 = fVar280 * fVar248 + (local_158 * fVar248 + local_198 * fVar237) * fVar237;
    fVar165 = fVar282 * fVar260 + (fStack_154 * fVar260 + fStack_194 * fVar239) * fVar239;
    fVar180 = fVar182 * fVar261 + (fStack_150 * fVar261 + fStack_190 * fVar246) * fVar246;
    fVar280 = fVar285 * fVar262 + (fStack_14c * fVar262 + fStack_18c * fVar247) * fVar247;
    fVar282 = fVar318 * fVar248 + (local_168 * fVar248 + local_1a8 * fVar237) * fVar237;
    fVar182 = fVar320 * fVar260 + (fStack_164 * fVar260 + fStack_1a4 * fVar239) * fVar239;
    fVar285 = fVar322 * fVar261 + (fStack_160 * fVar261 + fStack_1a0 * fVar246) * fVar246;
    fVar318 = fVar325 * fVar262 + (fStack_15c * fVar262 + fStack_19c * fVar247) * fVar247;
    local_508 = fVar248 * fVar132 + fVar237 * fVar327;
    fStack_504 = fVar260 * fVar89 + fVar239 * fVar281;
    fStack_500 = fVar261 * fVar130 + fVar246 * fVar283;
    fStack_4fc = fVar262 * fVar131 + fVar247 * fVar284;
    fVar323 = fVar248 * fVar270 + fVar237 * fVar286;
    fVar326 = fVar260 * fVar271 + fVar239 * fVar294;
    fVar328 = fVar261 * fVar164 + fVar246 * fVar296;
    fVar329 = fVar262 * fVar272 + fVar247 * fVar297;
    fVar310 = fVar248 * fVar293 + fVar237 * fVar133;
    fVar317 = fVar260 * fVar295 + fVar239 * fVar165;
    fVar319 = fVar261 * fVar298 + fVar246 * fVar180;
    fVar321 = fVar262 * fVar306 + fVar247 * fVar280;
    fVar320 = local_438 * 0.11111111;
    fVar183 = fVar248 * fVar307 + fVar237 * fVar282;
    fVar237 = fVar260 * fVar308 + fVar239 * fVar182;
    auVar168._0_8_ = CONCAT44(fVar237,fVar183);
    auVar168._8_4_ = fVar261 * fVar309 + fVar246 * fVar285;
    auVar168._12_4_ = fVar262 * fVar316 + fVar247 * fVar318;
    fVar322 = (fVar327 - fVar132) * 3.0 * fVar320;
    local_408 = (fVar281 - fVar89) * 3.0 * fVar320;
    fStack_404 = (fVar283 - fVar130) * 3.0 * fVar320;
    fStack_400 = (fVar284 - fVar131) * 3.0 * fVar320;
    fVar325 = (fVar286 - fVar270) * 3.0 * fVar320;
    fVar327 = (fVar294 - fVar271) * 3.0 * fVar320;
    fVar281 = (fVar296 - fVar164) * 3.0 * fVar320;
    fVar283 = (fVar297 - fVar272) * 3.0 * fVar320;
    fVar248 = (fVar133 - fVar293) * 3.0 * fVar320;
    local_418 = (fVar165 - fVar295) * 3.0 * fVar320;
    fStack_414 = (fVar180 - fVar298) * 3.0 * fVar320;
    fStack_410 = (fVar280 - fVar306) * 3.0 * fVar320;
    fVar130 = fVar320 * (fVar182 - fVar308) * 3.0;
    fVar132 = fVar320 * (fVar285 - fVar309) * 3.0;
    fVar165 = fVar320 * (fVar318 - fVar316) * 3.0;
    auVar145._4_4_ = auVar168._8_4_;
    auVar145._0_4_ = fVar237;
    auVar145._8_4_ = auVar168._12_4_;
    auVar145._12_4_ = 0;
    auVar146._0_8_ = CONCAT44(auVar168._8_4_ - fVar132,fVar237 - fVar130);
    auVar146._8_4_ = auVar168._12_4_ - fVar165;
    auVar146._12_4_ = 0;
    local_498._0_4_ = fVar326 - fVar323;
    local_498._4_4_ = fVar328 - fVar326;
    fStack_490 = fVar329 - fVar328;
    fStack_48c = 0.0 - fVar329;
    local_4a8._0_4_ = fVar317 - fVar310;
    local_4a8._4_4_ = fVar319 - fVar317;
    fStack_4a0 = fVar321 - fVar319;
    fStack_49c = 0.0 - fVar321;
    fVar89 = fVar325 * (float)local_4a8._0_4_ - fVar248 * (float)local_498._0_4_;
    fVar131 = fVar327 * (float)local_4a8._4_4_ - local_418 * (float)local_498._4_4_;
    fVar133 = fVar281 * fStack_4a0 - fStack_414 * fStack_490;
    fVar180 = fVar283 * fStack_49c - fStack_410 * fStack_48c;
    local_368._0_4_ = fStack_504 - local_508;
    local_368._4_4_ = fStack_500 - fStack_504;
    fStack_360 = fStack_4fc - fStack_500;
    fStack_35c = 0.0 - fStack_4fc;
    fVar239 = fVar248 * (float)local_368._0_4_ - fVar322 * (float)local_4a8._0_4_;
    fVar247 = local_418 * (float)local_368._4_4_ - local_408 * (float)local_4a8._4_4_;
    fVar261 = fStack_414 * fStack_360 - fStack_404 * fStack_4a0;
    fVar270 = fStack_410 * fStack_35c - fStack_400 * fStack_49c;
    fVar246 = fVar322 * (float)local_498._0_4_ - fVar325 * (float)local_368._0_4_;
    fVar260 = local_408 * (float)local_498._4_4_ - fVar327 * (float)local_368._4_4_;
    fVar262 = fStack_404 * fStack_490 - fVar281 * fStack_360;
    fVar271 = fStack_400 * fStack_48c - fVar283 * fStack_35c;
    auVar254._0_4_ = fVar246 * fVar246;
    auVar254._4_4_ = fVar260 * fVar260;
    auVar254._8_4_ = fVar262 * fVar262;
    auVar254._12_4_ = fVar271 * fVar271;
    auVar189._0_4_ =
         (float)local_368._0_4_ * (float)local_368._0_4_ +
         (float)local_498._0_4_ * (float)local_498._0_4_ +
         (float)local_4a8._0_4_ * (float)local_4a8._0_4_;
    auVar189._4_4_ =
         (float)local_368._4_4_ * (float)local_368._4_4_ +
         (float)local_498._4_4_ * (float)local_498._4_4_ +
         (float)local_4a8._4_4_ * (float)local_4a8._4_4_;
    auVar189._8_4_ = fStack_360 * fStack_360 + fStack_490 * fStack_490 + fStack_4a0 * fStack_4a0;
    auVar189._12_4_ = fStack_35c * fStack_35c + fStack_48c * fStack_48c + fStack_49c * fStack_49c;
    auVar90 = rcpps(auVar254,auVar189);
    fVar246 = auVar90._0_4_;
    fVar260 = auVar90._4_4_;
    fVar262 = auVar90._8_4_;
    fVar271 = auVar90._12_4_;
    fVar246 = (1.0 - fVar246 * auVar189._0_4_) * fVar246 + fVar246;
    fVar260 = (1.0 - fVar260 * auVar189._4_4_) * fVar260 + fVar260;
    fVar262 = (1.0 - fVar262 * auVar189._8_4_) * fVar262 + fVar262;
    fVar271 = (1.0 - fVar271 * auVar189._12_4_) * fVar271 + fVar271;
    fVar164 = (float)local_4a8._0_4_ * fVar327 - (float)local_498._0_4_ * local_418;
    fVar272 = (float)local_4a8._4_4_ * fVar281 - (float)local_498._4_4_ * fStack_414;
    fVar280 = fStack_4a0 * fVar283 - fStack_490 * fStack_410;
    fVar182 = fStack_49c * 0.0 - fStack_48c * 0.0;
    fStack_40c = 0.0;
    fVar285 = (float)local_368._0_4_ * local_418 - (float)local_4a8._0_4_ * local_408;
    fVar293 = (float)local_368._4_4_ * fStack_414 - (float)local_4a8._4_4_ * fStack_404;
    fVar295 = fStack_360 * fStack_410 - fStack_4a0 * fStack_400;
    fVar298 = fStack_35c * 0.0 - fStack_49c * 0.0;
    fStack_3fc = 0.0;
    fVar306 = (float)local_498._0_4_ * local_408 - (float)local_368._0_4_ * fVar327;
    fVar308 = (float)local_498._4_4_ * fStack_404 - (float)local_368._4_4_ * fVar281;
    fVar309 = fStack_490 * fStack_400 - fStack_360 * fVar283;
    fVar316 = fStack_48c * 0.0 - fStack_35c * 0.0;
    auVar110._0_4_ = (fVar89 * fVar89 + fVar239 * fVar239 + auVar254._0_4_) * fVar246;
    auVar110._4_4_ = (fVar131 * fVar131 + fVar247 * fVar247 + auVar254._4_4_) * fVar260;
    auVar110._8_4_ = (fVar133 * fVar133 + fVar261 * fVar261 + auVar254._8_4_) * fVar262;
    auVar110._12_4_ = (fVar180 * fVar180 + fVar270 * fVar270 + auVar254._12_4_) * fVar271;
    auVar263._0_4_ = (fVar164 * fVar164 + fVar285 * fVar285 + fVar306 * fVar306) * fVar246;
    auVar263._4_4_ = (fVar272 * fVar272 + fVar293 * fVar293 + fVar308 * fVar308) * fVar260;
    auVar263._8_4_ = (fVar280 * fVar280 + fVar295 * fVar295 + fVar309 * fVar309) * fVar262;
    auVar263._12_4_ = (fVar182 * fVar182 + fVar298 * fVar298 + fVar316 * fVar316) * fVar271;
    auVar90 = maxps(auVar110,auVar263);
    auVar255._8_4_ = auVar168._8_4_;
    auVar255._0_8_ = auVar168._0_8_;
    auVar255._12_4_ = auVar168._12_4_;
    auVar27._4_4_ = fVar237 + fVar130;
    auVar27._0_4_ = fVar183 + fVar320 * (fVar282 - fVar307) * 3.0;
    auVar27._8_4_ = auVar168._8_4_ + fVar132;
    auVar27._12_4_ = auVar168._12_4_ + fVar165;
    auVar277 = maxps(auVar255,auVar27);
    auVar231._8_4_ = auVar146._8_4_;
    auVar231._0_8_ = auVar146._0_8_;
    auVar231._12_4_ = 0;
    auVar167 = maxps(auVar231,auVar145);
    auVar256 = maxps(auVar277,auVar167);
    auVar277 = minps(auVar168,auVar27);
    auVar167 = minps(auVar146,auVar145);
    auVar277 = minps(auVar277,auVar167);
    auVar90 = sqrtps(auVar90,auVar90);
    auVar167 = rsqrtps(auVar90,auVar189);
    fVar89 = auVar167._0_4_;
    fVar130 = auVar167._4_4_;
    fVar131 = auVar167._8_4_;
    fVar132 = auVar167._12_4_;
    fVar237 = fVar89 * fVar89 * auVar189._0_4_ * -0.5 * fVar89 + fVar89 * 1.5;
    fVar239 = fVar130 * fVar130 * auVar189._4_4_ * -0.5 * fVar130 + fVar130 * 1.5;
    fVar246 = fVar131 * fVar131 * auVar189._8_4_ * -0.5 * fVar131 + fVar131 * 1.5;
    fVar247 = fVar132 * fVar132 * auVar189._12_4_ * -0.5 * fVar132 + fVar132 * 1.5;
    fVar308 = 0.0 - fVar323;
    fVar309 = 0.0 - fVar326;
    fVar316 = 0.0 - fVar328;
    fVar318 = 0.0 - fVar329;
    local_428 = 0.0 - fVar310;
    fStack_424 = 0.0 - fVar317;
    fStack_420 = 0.0 - fVar319;
    fStack_41c = 0.0 - fVar321;
    fVar271 = 0.0 - local_508;
    fVar272 = 0.0 - fStack_504;
    fVar282 = 0.0 - fStack_500;
    fVar285 = 0.0 - fStack_4fc;
    auVar232._0_4_ =
         fVar181 * (float)local_498._0_4_ * fVar237 +
         (float)local_5b8._4_4_ * (float)local_4a8._0_4_ * fVar237;
    auVar232._4_4_ =
         fVar181 * (float)local_498._4_4_ * fVar239 +
         (float)local_5b8._4_4_ * (float)local_4a8._4_4_ * fVar239;
    auVar232._8_4_ = fVar181 * fStack_490 * fVar246 + (float)local_5b8._4_4_ * fStack_4a0 * fVar246;
    auVar232._12_4_ = fVar181 * fStack_48c * fVar247 + (float)local_5b8._4_4_ * fStack_49c * fVar247
    ;
    auVar331._0_4_ = local_518 * (float)local_368._0_4_ * fVar237 + auVar232._0_4_;
    auVar331._4_4_ = fStack_514 * (float)local_368._4_4_ * fVar239 + auVar232._4_4_;
    auVar331._8_4_ = fStack_510 * fStack_360 * fVar246 + auVar232._8_4_;
    auVar331._12_4_ = fStack_50c * fStack_35c * fVar247 + auVar232._12_4_;
    fVar260 = (float)local_368._0_4_ * fVar237 * fVar271 +
              (float)local_498._0_4_ * fVar237 * fVar308 +
              (float)local_4a8._0_4_ * fVar237 * local_428;
    fVar261 = (float)local_368._4_4_ * fVar239 * fVar272 +
              (float)local_498._4_4_ * fVar239 * fVar309 +
              (float)local_4a8._4_4_ * fVar239 * fStack_424;
    fVar262 = fStack_360 * fVar246 * fVar282 +
              fStack_490 * fVar246 * fVar316 + fStack_4a0 * fVar246 * fStack_420;
    fVar270 = fStack_35c * fVar247 * fVar285 +
              fStack_48c * fVar247 * fVar318 + fStack_49c * fVar247 * fStack_41c;
    fVar295 = (local_518 * fVar271 + fVar181 * fVar308 + (float)local_5b8._4_4_ * local_428) -
              auVar331._0_4_ * fVar260;
    fVar298 = (fStack_514 * fVar272 + fVar181 * fVar309 + (float)local_5b8._4_4_ * fStack_424) -
              auVar331._4_4_ * fVar261;
    fVar306 = (fStack_510 * fVar282 + fVar181 * fVar316 + (float)local_5b8._4_4_ * fStack_420) -
              auVar331._8_4_ * fVar262;
    fVar307 = (fStack_50c * fVar285 + fVar181 * fVar318 + (float)local_5b8._4_4_ * fStack_41c) -
              auVar331._12_4_ * fVar270;
    fVar320 = (fVar271 * fVar271 + fVar308 * fVar308 + local_428 * local_428) - fVar260 * fVar260;
    fVar284 = (fVar272 * fVar272 + fVar309 * fVar309 + fStack_424 * fStack_424) - fVar261 * fVar261;
    fVar286 = (fVar282 * fVar282 + fVar316 * fVar316 + fStack_420 * fStack_420) - fVar262 * fVar262;
    fVar294 = (fVar285 * fVar285 + fVar318 * fVar318 + fStack_41c * fStack_41c) - fVar270 * fVar270;
    fVar89 = (auVar256._0_4_ + auVar90._0_4_) * 1.0000002;
    fVar130 = (auVar256._4_4_ + auVar90._4_4_) * 1.0000002;
    fVar131 = (auVar256._8_4_ + auVar90._8_4_) * 1.0000002;
    fVar132 = (auVar256._12_4_ + auVar90._12_4_) * 1.0000002;
    fVar89 = fVar320 - fVar89 * fVar89;
    fVar130 = fVar284 - fVar130 * fVar130;
    fVar131 = fVar286 - fVar131 * fVar131;
    fVar132 = fVar294 - fVar132 * fVar132;
    local_378._0_4_ = auVar331._0_4_ * auVar331._0_4_;
    local_378._4_4_ = auVar331._4_4_ * auVar331._4_4_;
    fStack_370 = auVar331._8_4_ * auVar331._8_4_;
    fStack_36c = auVar331._12_4_ * auVar331._12_4_;
    fVar164 = local_128 - (float)local_378._0_4_;
    fVar280 = fStack_124 - (float)local_378._4_4_;
    fVar182 = fStack_120 - fStack_370;
    fVar293 = fStack_11c - fStack_36c;
    fVar295 = fVar295 + fVar295;
    fVar298 = fVar298 + fVar298;
    fVar306 = fVar306 + fVar306;
    fVar307 = fVar307 + fVar307;
    local_458 = fVar295 * fVar295;
    fStack_454 = fVar298 * fVar298;
    fStack_450 = fVar306 * fVar306;
    fStack_44c = fVar307 * fVar307;
    local_478 = fVar164 * 4.0;
    fStack_474 = fVar280 * 4.0;
    fStack_470 = fVar182 * 4.0;
    fStack_46c = fVar293 * 4.0;
    auVar257._0_4_ = local_458 - local_478 * fVar89;
    auVar257._4_4_ = fStack_454 - fStack_474 * fVar130;
    auVar257._8_4_ = fStack_450 - fStack_470 * fVar131;
    auVar257._12_4_ = fStack_44c - fStack_46c * fVar132;
    auVar204._4_4_ = -(uint)(0.0 <= auVar257._4_4_);
    auVar204._0_4_ = -(uint)(0.0 <= auVar257._0_4_);
    auVar204._8_4_ = -(uint)(0.0 <= auVar257._8_4_);
    auVar204._12_4_ = -(uint)(0.0 <= auVar257._12_4_);
    uVar77 = (undefined4)((ulong)lVar67 >> 0x20);
    iVar64 = movmskps((int)lVar67,auVar204);
    if (iVar64 == 0) {
      iVar64 = 0;
      auVar148 = _DAT_01feb9f0;
      auVar234 = _DAT_01feba00;
    }
    else {
      auVar256 = sqrtps(_local_5b8,auVar257);
      bVar22 = 0.0 <= auVar257._0_4_;
      uVar83 = -(uint)bVar22;
      bVar23 = 0.0 <= auVar257._4_4_;
      uVar84 = -(uint)bVar23;
      bVar24 = 0.0 <= auVar257._8_4_;
      uVar85 = -(uint)bVar24;
      bVar25 = 0.0 <= auVar257._12_4_;
      uVar86 = -(uint)bVar25;
      auVar147._0_4_ = fVar164 + fVar164;
      auVar147._4_4_ = fVar280 + fVar280;
      auVar147._8_4_ = fVar182 + fVar182;
      auVar147._12_4_ = fVar293 + fVar293;
      auVar167 = rcpps(auVar232,auVar147);
      fVar133 = auVar167._0_4_;
      fVar180 = auVar167._4_4_;
      fVar296 = auVar167._8_4_;
      fVar330 = auVar167._12_4_;
      fVar133 = (1.0 - auVar147._0_4_ * fVar133) * fVar133 + fVar133;
      fVar180 = (1.0 - auVar147._4_4_ * fVar180) * fVar180 + fVar180;
      fVar296 = (1.0 - auVar147._8_4_ * fVar296) * fVar296 + fVar296;
      fVar330 = (1.0 - auVar147._12_4_ * fVar330) * fVar330 + fVar330;
      fVar165 = (-fVar295 - auVar256._0_4_) * fVar133;
      fVar183 = (-fVar298 - auVar256._4_4_) * fVar180;
      fVar297 = (-fVar306 - auVar256._8_4_) * fVar296;
      fVar238 = (-fVar307 - auVar256._12_4_) * fVar330;
      fVar133 = (auVar256._0_4_ - fVar295) * fVar133;
      fVar180 = (auVar256._4_4_ - fVar298) * fVar180;
      fVar296 = (auVar256._8_4_ - fVar306) * fVar296;
      fVar330 = (auVar256._12_4_ - fVar307) * fVar330;
      local_328[0] = (auVar331._0_4_ * fVar165 + fVar260) * fVar237;
      local_328[1] = (auVar331._4_4_ * fVar183 + fVar261) * fVar239;
      local_328[2] = (auVar331._8_4_ * fVar297 + fVar262) * fVar246;
      local_328[3] = (auVar331._12_4_ * fVar238 + fVar270) * fVar247;
      local_338[0] = (auVar331._0_4_ * fVar133 + fVar260) * fVar237;
      local_338[1] = (auVar331._4_4_ * fVar180 + fVar261) * fVar239;
      local_338[2] = (auVar331._8_4_ * fVar296 + fVar262) * fVar246;
      local_338[3] = (auVar331._12_4_ * fVar330 + fVar270) * fVar247;
      auVar233._0_4_ = (uint)fVar165 & uVar83;
      auVar233._4_4_ = (uint)fVar183 & uVar84;
      auVar233._8_4_ = (uint)fVar297 & uVar85;
      auVar233._12_4_ = (uint)fVar238 & uVar86;
      auVar148._0_8_ = CONCAT44(~uVar84,~uVar83) & 0x7f8000007f800000;
      auVar148._8_4_ = ~uVar85 & 0x7f800000;
      auVar148._12_4_ = ~uVar86 & 0x7f800000;
      auVar148 = auVar148 | auVar233;
      auVar264._0_4_ = (uint)fVar133 & uVar83;
      auVar264._4_4_ = (uint)fVar180 & uVar84;
      auVar264._8_4_ = (uint)fVar296 & uVar85;
      auVar264._12_4_ = (uint)fVar330 & uVar86;
      auVar234._0_8_ = CONCAT44(~uVar84,~uVar83) & 0xff800000ff800000;
      auVar234._8_4_ = ~uVar85 & 0xff800000;
      auVar234._12_4_ = ~uVar86 & 0xff800000;
      auVar234 = auVar234 | auVar264;
      auVar265._0_8_ = CONCAT44(local_378._4_4_,local_378._0_4_) & 0x7fffffff7fffffff;
      auVar265._8_4_ = ABS(fStack_370);
      auVar265._12_4_ = ABS(fStack_36c);
      auVar39._4_4_ = fStack_2d4;
      auVar39._0_4_ = local_2d8;
      auVar39._8_4_ = fStack_2d0;
      auVar39._12_4_ = fStack_2cc;
      auVar167 = maxps(auVar39,auVar265);
      fVar133 = auVar167._0_4_ * 1.9073486e-06;
      fVar165 = auVar167._4_4_ * 1.9073486e-06;
      fVar180 = auVar167._8_4_ * 1.9073486e-06;
      fVar183 = auVar167._12_4_ * 1.9073486e-06;
      auVar266._0_4_ = -(uint)(ABS(fVar164) < fVar133 && bVar22);
      auVar266._4_4_ = -(uint)(ABS(fVar280) < fVar165 && bVar23);
      auVar266._8_4_ = -(uint)(ABS(fVar182) < fVar180 && bVar24);
      auVar266._12_4_ = -(uint)(ABS(fVar293) < fVar183 && bVar25);
      iVar64 = movmskps(iVar64,auVar266);
      if (iVar64 != 0) {
        uVar83 = -(uint)(fVar89 <= 0.0);
        uVar84 = -(uint)(fVar130 <= 0.0);
        uVar85 = -(uint)(fVar131 <= 0.0);
        uVar86 = -(uint)(fVar132 <= 0.0);
        auVar324._0_4_ = (uVar83 & 0xff800000 | ~uVar83 & 0x7f800000) & auVar266._0_4_;
        auVar324._4_4_ = (uVar84 & 0xff800000 | ~uVar84 & 0x7f800000) & auVar266._4_4_;
        auVar324._8_4_ = (uVar85 & 0xff800000 | ~uVar85 & 0x7f800000) & auVar266._8_4_;
        auVar324._12_4_ = (uVar86 & 0xff800000 | ~uVar86 & 0x7f800000) & auVar266._12_4_;
        auVar210._0_4_ = ~auVar266._0_4_ & auVar148._0_4_;
        auVar210._4_4_ = ~auVar266._4_4_ & auVar148._4_4_;
        auVar210._8_4_ = ~auVar266._8_4_ & auVar148._8_4_;
        auVar210._12_4_ = ~auVar266._12_4_ & auVar148._12_4_;
        auVar148 = auVar210 | auVar324;
        auVar211._0_4_ = (uVar83 & 0x7f800000 | ~uVar83 & 0xff800000) & auVar266._0_4_;
        auVar211._4_4_ = (uVar84 & 0x7f800000 | ~uVar84 & 0xff800000) & auVar266._4_4_;
        auVar211._8_4_ = (uVar85 & 0x7f800000 | ~uVar85 & 0xff800000) & auVar266._8_4_;
        auVar211._12_4_ = (uVar86 & 0x7f800000 | ~uVar86 & 0xff800000) & auVar266._12_4_;
        auVar269._0_4_ = ~auVar266._0_4_ & auVar234._0_4_;
        auVar269._4_4_ = ~auVar266._4_4_ & auVar234._4_4_;
        auVar269._8_4_ = ~auVar266._8_4_ & auVar234._8_4_;
        auVar269._12_4_ = ~auVar266._12_4_ & auVar234._12_4_;
        auVar234 = auVar269 | auVar211;
        auVar204._4_4_ = -(uint)((fVar165 <= ABS(fVar280) || fVar130 <= 0.0) && bVar23);
        auVar204._0_4_ = -(uint)((fVar133 <= ABS(fVar164) || fVar89 <= 0.0) && bVar22);
        auVar204._8_4_ = -(uint)((fVar180 <= ABS(fVar182) || fVar131 <= 0.0) && bVar24);
        auVar204._12_4_ = -(uint)((fVar183 <= ABS(fVar293) || fVar132 <= 0.0) && bVar25);
      }
    }
    auVar205._0_4_ = (auVar204._0_4_ << 0x1f) >> 0x1f;
    auVar205._4_4_ = (auVar204._4_4_ << 0x1f) >> 0x1f;
    auVar205._8_4_ = (auVar204._8_4_ << 0x1f) >> 0x1f;
    auVar205._12_4_ = (auVar204._12_4_ << 0x1f) >> 0x1f;
    auVar205 = auVar205 & local_1c8;
    iVar64 = movmskps(iVar64,auVar205);
    lVar67 = CONCAT44(uVar77,iVar64);
    fVar132 = local_488;
    fVar89 = fStack_484;
    fVar130 = fStack_480;
    fVar131 = fStack_47c;
    fVar183 = local_528;
    fVar133 = fStack_524;
    fVar165 = fStack_520;
    fVar180 = fStack_51c;
    if (iVar64 != 0) {
      local_538._4_4_ = fVar298;
      local_538._0_4_ = fVar295;
      fStack_530 = fVar306;
      fStack_52c = fVar307;
      local_2e8 = fVar260;
      fStack_2e4 = fVar261;
      fStack_2e0 = fVar262;
      fStack_2dc = fVar270;
      local_1f8 = auVar331;
      local_3e8 = fVar164;
      fStack_3e4 = fVar280;
      fStack_3e0 = fVar182;
      fStack_3dc = fVar293;
      local_1e8 = fVar237;
      fStack_1e4 = fVar239;
      fStack_1e0 = fVar246;
      fStack_1dc = fVar247;
      auVar332._0_4_ = *(float *)(ray + k * 4 + 0x80) - (float)local_348._0_4_;
      auVar332._4_4_ = auVar332._0_4_;
      auVar332._8_4_ = auVar332._0_4_;
      auVar332._12_4_ = auVar332._0_4_;
      auVar333 = minps(auVar332,auVar234);
      auVar41._4_4_ = fStack_1b4;
      auVar41._0_4_ = local_1b8;
      auVar41._8_4_ = fStack_1b0;
      auVar41._12_4_ = fStack_1ac;
      auVar256 = maxps(auVar41,auVar148);
      auVar111._0_4_ = local_428 * fVar248;
      auVar111._4_4_ = fStack_424 * local_418;
      auVar111._8_4_ = fStack_420 * fStack_414;
      auVar111._12_4_ = fStack_41c * fStack_410;
      auVar304._0_4_ = fVar322 * local_518 + fVar325 * fVar181 + fVar248 * (float)local_5b8._4_4_;
      auVar304._4_4_ =
           local_408 * fStack_514 + fVar327 * fVar181 + local_418 * (float)local_5b8._4_4_;
      auVar304._8_4_ =
           fStack_404 * fStack_510 + fVar281 * fVar181 + fStack_414 * (float)local_5b8._4_4_;
      auVar304._12_4_ =
           fStack_400 * fStack_50c + fVar283 * fVar181 + fStack_410 * (float)local_5b8._4_4_;
      auVar167 = rcpps(auVar111,auVar304);
      fVar248 = auVar167._0_4_;
      fVar296 = auVar167._4_4_;
      fVar297 = auVar167._8_4_;
      fVar330 = auVar167._12_4_;
      fVar248 = ((1.0 - auVar304._0_4_ * fVar248) * fVar248 + fVar248) *
                -(fVar271 * fVar322 + fVar308 * fVar325 + auVar111._0_4_);
      fVar271 = ((1.0 - auVar304._4_4_ * fVar296) * fVar296 + fVar296) *
                -(fVar272 * local_408 + fVar309 * fVar327 + auVar111._4_4_);
      fVar272 = ((1.0 - auVar304._8_4_ * fVar297) * fVar297 + fVar297) *
                -(fVar282 * fStack_404 + fVar316 * fVar281 + auVar111._8_4_);
      fVar282 = ((1.0 - auVar304._12_4_ * fVar330) * fVar330 + fVar330) *
                -(fVar285 * fStack_400 + fVar318 * fVar283 + auVar111._12_4_);
      uVar83 = -(uint)(auVar304._0_4_ < 0.0 || ABS(auVar304._0_4_) < 1e-18);
      uVar84 = -(uint)(auVar304._4_4_ < 0.0 || ABS(auVar304._4_4_) < 1e-18);
      uVar85 = -(uint)(auVar304._8_4_ < 0.0 || ABS(auVar304._8_4_) < 1e-18);
      uVar86 = -(uint)(auVar304._12_4_ < 0.0 || ABS(auVar304._12_4_) < 1e-18);
      auVar235._0_8_ = CONCAT44(uVar84,uVar83) & 0xff800000ff800000;
      auVar235._8_4_ = uVar85 & 0xff800000;
      auVar235._12_4_ = uVar86 & 0xff800000;
      auVar112._0_4_ = ~uVar83 & (uint)fVar248;
      auVar112._4_4_ = ~uVar84 & (uint)fVar271;
      auVar112._8_4_ = ~uVar85 & (uint)fVar272;
      auVar112._12_4_ = ~uVar86 & (uint)fVar282;
      auVar256 = maxps(auVar256,auVar112 | auVar235);
      uVar83 = -(uint)(0.0 < auVar304._0_4_ || ABS(auVar304._0_4_) < 1e-18);
      uVar84 = -(uint)(0.0 < auVar304._4_4_ || ABS(auVar304._4_4_) < 1e-18);
      uVar85 = -(uint)(0.0 < auVar304._8_4_ || ABS(auVar304._8_4_) < 1e-18);
      uVar86 = -(uint)(0.0 < auVar304._12_4_ || ABS(auVar304._12_4_) < 1e-18);
      auVar113._0_8_ = CONCAT44(uVar84,uVar83) & 0x7f8000007f800000;
      auVar113._8_4_ = uVar85 & 0x7f800000;
      auVar113._12_4_ = uVar86 & 0x7f800000;
      auVar305._0_4_ = ~uVar83 & (uint)fVar248;
      auVar305._4_4_ = ~uVar84 & (uint)fVar271;
      auVar305._8_4_ = ~uVar85 & (uint)fVar272;
      auVar305._12_4_ = ~uVar86 & (uint)fVar282;
      auVar333 = minps(auVar333,auVar305 | auVar113);
      auVar149._0_4_ = (0.0 - fVar326) * -fVar327 + (0.0 - fVar317) * -local_418;
      auVar149._4_4_ = (0.0 - fVar328) * -fVar281 + (0.0 - fVar319) * -fStack_414;
      auVar149._8_4_ = (0.0 - fVar329) * -fVar283 + (0.0 - fVar321) * -fStack_410;
      auVar149._12_4_ = 0x80000000;
      auVar169._0_4_ =
           -local_408 * local_518 + -fVar327 * fVar181 + -local_418 * (float)local_5b8._4_4_;
      auVar169._4_4_ =
           -fStack_404 * fStack_514 + -fVar281 * fVar181 + -fStack_414 * (float)local_5b8._4_4_;
      auVar169._8_4_ =
           -fStack_400 * fStack_510 + -fVar283 * fVar181 + -fStack_410 * (float)local_5b8._4_4_;
      auVar169._12_4_ = fStack_50c * -0.0 + fVar181 * -0.0 + (float)local_5b8._4_4_ * -0.0;
      auVar167 = rcpps(auVar149,auVar169);
      fVar248 = auVar167._0_4_;
      fVar271 = auVar167._4_4_;
      fVar272 = auVar167._8_4_;
      fVar282 = auVar167._12_4_;
      fVar248 = (((float)DAT_01feca10 - auVar169._0_4_ * fVar248) * fVar248 + fVar248) *
                -((0.0 - fStack_504) * -local_408 + auVar149._0_4_);
      fVar271 = ((DAT_01feca10._4_4_ - auVar169._4_4_ * fVar271) * fVar271 + fVar271) *
                -((0.0 - fStack_500) * -fStack_404 + auVar149._4_4_);
      fVar272 = ((DAT_01feca10._8_4_ - auVar169._8_4_ * fVar272) * fVar272 + fVar272) *
                -((0.0 - fStack_4fc) * -fStack_400 + auVar149._8_4_);
      fVar282 = ((DAT_01feca10._12_4_ - auVar169._12_4_ * fVar282) * fVar282 + fVar282) * 0.0;
      uVar83 = -(uint)(auVar169._0_4_ < 0.0 || ABS(auVar169._0_4_) < 1e-18);
      uVar84 = -(uint)(auVar169._4_4_ < 0.0 || ABS(auVar169._4_4_) < 1e-18);
      uVar85 = -(uint)(auVar169._8_4_ < 0.0 || ABS(auVar169._8_4_) < 1e-18);
      uVar86 = -(uint)(auVar169._12_4_ < 0.0 || ABS(auVar169._12_4_) < 1e-18);
      auVar150._0_8_ = CONCAT44(uVar84,uVar83) & 0xff800000ff800000;
      auVar150._8_4_ = uVar85 & 0xff800000;
      auVar150._12_4_ = uVar86 & 0xff800000;
      auVar114._0_4_ = ~uVar83 & (uint)fVar248;
      auVar114._4_4_ = ~uVar84 & (uint)fVar271;
      auVar114._8_4_ = ~uVar85 & (uint)fVar272;
      auVar114._12_4_ = ~uVar86 & (uint)fVar282;
      local_468 = maxps(auVar256,auVar114 | auVar150);
      uVar83 = -(uint)(0.0 < auVar169._0_4_ || ABS(auVar169._0_4_) < 1e-18);
      uVar84 = -(uint)(0.0 < auVar169._4_4_ || ABS(auVar169._4_4_) < 1e-18);
      uVar85 = -(uint)(0.0 < auVar169._8_4_ || ABS(auVar169._8_4_) < 1e-18);
      uVar86 = -(uint)(0.0 < auVar169._12_4_ || ABS(auVar169._12_4_) < 1e-18);
      auVar115._0_8_ = CONCAT44(uVar84,uVar83) & 0x7f8000007f800000;
      auVar115._8_4_ = uVar85 & 0x7f800000;
      auVar115._12_4_ = uVar86 & 0x7f800000;
      auVar170._0_4_ = ~uVar83 & (uint)fVar248;
      auVar170._4_4_ = ~uVar84 & (uint)fVar271;
      auVar170._8_4_ = ~uVar85 & (uint)fVar272;
      auVar170._12_4_ = ~uVar86 & (uint)fVar282;
      auVar167 = minps(auVar333,auVar170 | auVar115);
      fVar248 = local_468._0_4_;
      fVar271 = local_468._4_4_;
      fVar272 = local_468._8_4_;
      fVar282 = local_468._12_4_;
      auVar258._0_4_ = -(uint)(fVar248 <= auVar167._0_4_) & auVar205._0_4_;
      auVar258._4_4_ = -(uint)(fVar271 <= auVar167._4_4_) & auVar205._4_4_;
      auVar258._8_4_ = -(uint)(fVar272 <= auVar167._8_4_) & auVar205._8_4_;
      auVar258._12_4_ = -(uint)(fVar282 <= auVar167._12_4_) & auVar205._12_4_;
      iVar64 = movmskps(iVar64,auVar258);
      lVar67 = CONCAT44(uVar77,iVar64);
      if (iVar64 != 0) {
        auVar28._4_4_ = (auVar277._4_4_ - auVar90._4_4_) * 0.99999976;
        auVar28._0_4_ = (auVar277._0_4_ - auVar90._0_4_) * 0.99999976;
        auVar28._8_4_ = (auVar277._8_4_ - auVar90._8_4_) * 0.99999976;
        auVar28._12_4_ = (auVar277._12_4_ - auVar90._12_4_) * 0.99999976;
        auVar90 = maxps(ZEXT816(0),auVar28);
        auVar38._4_4_ = local_328[1];
        auVar38._0_4_ = local_328[0];
        auVar38._8_4_ = local_328[2];
        auVar38._12_4_ = local_328[3];
        auVar277 = minps(auVar38,_DAT_01feca10);
        auVar241._0_12_ = ZEXT812(0);
        auVar241._12_4_ = 0;
        auVar277 = maxps(auVar277,auVar241);
        auVar37._4_4_ = local_338[1];
        auVar37._0_4_ = local_338[0];
        auVar37._8_4_ = local_338[2];
        auVar37._12_4_ = local_338[3];
        auVar256 = minps(auVar37,_DAT_01feca10);
        auVar256 = maxps(auVar256,auVar241);
        local_328[0] = (auVar277._0_4_ + 0.0) * 0.25 * local_438 + (float)local_358;
        local_328[1] = (auVar277._4_4_ + 1.0) * 0.25 * local_438 + (float)local_358;
        local_328[2] = (auVar277._8_4_ + 2.0) * 0.25 * local_438 + (float)local_358;
        local_328[3] = (auVar277._12_4_ + 3.0) * 0.25 * local_438 + (float)local_358;
        local_338[0] = (auVar256._0_4_ + 0.0) * 0.25 * local_438 + (float)local_358;
        local_338[1] = (auVar256._4_4_ + 1.0) * 0.25 * local_438 + (float)local_358;
        local_338[2] = (auVar256._8_4_ + 2.0) * 0.25 * local_438 + (float)local_358;
        local_338[3] = (auVar256._12_4_ + 3.0) * 0.25 * local_438 + (float)local_358;
        auVar151._0_4_ = fVar320 - auVar90._0_4_ * auVar90._0_4_;
        auVar151._4_4_ = fVar284 - auVar90._4_4_ * auVar90._4_4_;
        auVar151._8_4_ = fVar286 - auVar90._8_4_ * auVar90._8_4_;
        auVar151._12_4_ = fVar294 - auVar90._12_4_ * auVar90._12_4_;
        auVar267._0_4_ = local_458 - local_478 * auVar151._0_4_;
        auVar267._4_4_ = fStack_454 - fStack_474 * auVar151._4_4_;
        auVar267._8_4_ = fStack_450 - fStack_470 * auVar151._8_4_;
        auVar267._12_4_ = fStack_44c - fStack_46c * auVar151._12_4_;
        local_388._4_4_ = -(uint)(0.0 <= auVar267._4_4_);
        local_388._0_4_ = -(uint)(0.0 <= auVar267._0_4_);
        local_388._8_4_ = -(uint)(0.0 <= auVar267._8_4_);
        local_388._12_4_ = -(uint)(0.0 <= auVar267._12_4_);
        iVar64 = movmskps(iVar64,local_388);
        if (iVar64 == 0) {
          fVar260 = 0.0;
          fVar261 = 0.0;
          fVar262 = 0.0;
          fVar270 = 0.0;
          fVar237 = 0.0;
          fVar239 = 0.0;
          fVar285 = 0.0;
          fVar295 = 0.0;
          auVar259 = ZEXT816(0);
          local_6a8 = 0.0;
          fStack_6a4 = 0.0;
          fStack_6a0 = 0.0;
          fStack_69c = 0.0;
          _local_538 = ZEXT816(0);
          iVar64 = 0;
          auVar152 = _DAT_01feba00;
          auVar268 = _DAT_01feb9f0;
        }
        else {
          auVar277 = sqrtps(auVar241,auVar267);
          auVar116._0_4_ = fVar164 + fVar164;
          auVar116._4_4_ = fVar280 + fVar280;
          auVar116._8_4_ = fVar182 + fVar182;
          auVar116._12_4_ = fVar293 + fVar293;
          auVar90 = rcpps(auVar151,auVar116);
          fVar308 = auVar90._0_4_;
          fVar309 = auVar90._4_4_;
          fVar316 = auVar90._8_4_;
          fVar318 = auVar90._12_4_;
          fVar308 = ((float)DAT_01feca10 - auVar116._0_4_ * fVar308) * fVar308 + fVar308;
          fVar309 = (DAT_01feca10._4_4_ - auVar116._4_4_ * fVar309) * fVar309 + fVar309;
          fVar316 = (DAT_01feca10._8_4_ - auVar116._8_4_ * fVar316) * fVar316 + fVar316;
          fVar318 = (DAT_01feca10._12_4_ - auVar116._12_4_ * fVar318) * fVar318 + fVar318;
          fVar322 = (-fVar295 - auVar277._0_4_) * fVar308;
          fVar325 = (-fVar298 - auVar277._4_4_) * fVar309;
          fVar327 = (-fVar306 - auVar277._8_4_) * fVar316;
          fVar283 = (-fVar307 - auVar277._12_4_) * fVar318;
          fVar308 = (auVar277._0_4_ - fVar295) * fVar308;
          fVar309 = (auVar277._4_4_ - fVar298) * fVar309;
          fVar316 = (auVar277._8_4_ - fVar306) * fVar316;
          fVar318 = (auVar277._12_4_ - fVar307) * fVar318;
          fVar298 = (auVar331._0_4_ * fVar322 + fVar260) * fVar237;
          fVar306 = (auVar331._4_4_ * fVar325 + fVar261) * fVar239;
          fVar307 = (auVar331._8_4_ * fVar327 + fVar262) * fVar246;
          fVar320 = (auVar331._12_4_ * fVar283 + fVar270) * fVar247;
          local_6a8 = fVar181 * fVar322 - ((float)local_498._0_4_ * fVar298 + fVar323);
          fStack_6a4 = fVar181 * fVar325 - ((float)local_498._4_4_ * fVar306 + fVar326);
          fStack_6a0 = fVar181 * fVar327 - (fStack_490 * fVar307 + fVar328);
          fStack_69c = fVar181 * fVar283 - (fStack_48c * fVar320 + fVar329);
          local_538._4_4_ =
               (float)local_5b8._4_4_ * fVar325 - (fVar306 * (float)local_4a8._4_4_ + fVar317);
          local_538._0_4_ =
               (float)local_5b8._4_4_ * fVar322 - (fVar298 * (float)local_4a8._0_4_ + fVar310);
          fStack_530 = (float)local_5b8._4_4_ * fVar327 - (fVar307 * fStack_4a0 + fVar319);
          fStack_52c = (float)local_5b8._4_4_ * fVar283 - (fVar320 * fStack_49c + fVar321);
          fVar237 = (auVar331._0_4_ * fVar308 + fVar260) * fVar237;
          fVar239 = (auVar331._4_4_ * fVar309 + fVar261) * fVar239;
          fVar246 = (auVar331._8_4_ * fVar316 + fVar262) * fVar246;
          fVar247 = (auVar331._12_4_ * fVar318 + fVar270) * fVar247;
          auVar241._4_4_ = fStack_514 * fVar309 - ((float)local_368._4_4_ * fVar239 + fStack_504);
          auVar241._0_4_ = local_518 * fVar308 - ((float)local_368._0_4_ * fVar237 + local_508);
          fVar260 = fVar181 * fVar308 - ((float)local_498._0_4_ * fVar237 + fVar323);
          fVar261 = fVar181 * fVar309 - ((float)local_498._4_4_ * fVar239 + fVar326);
          fVar262 = fVar181 * fVar316 - (fStack_490 * fVar246 + fVar328);
          fVar270 = fVar181 * fVar318 - (fStack_48c * fVar247 + fVar329);
          bVar22 = 0.0 <= auVar267._0_4_;
          uVar83 = -(uint)bVar22;
          bVar23 = 0.0 <= auVar267._4_4_;
          uVar84 = -(uint)bVar23;
          bVar24 = 0.0 <= auVar267._8_4_;
          uVar85 = -(uint)bVar24;
          bVar25 = 0.0 <= auVar267._12_4_;
          uVar86 = -(uint)bVar25;
          fVar237 = (float)local_5b8._4_4_ * fVar308 - (fVar237 * (float)local_4a8._0_4_ + fVar310);
          fVar239 = (float)local_5b8._4_4_ * fVar309 - (fVar239 * (float)local_4a8._4_4_ + fVar317);
          fVar285 = (float)local_5b8._4_4_ * fVar316 - (fVar246 * fStack_4a0 + fVar319);
          fVar295 = (float)local_5b8._4_4_ * fVar318 - (fVar247 * fStack_49c + fVar321);
          auVar278._0_4_ = (uint)fVar322 & uVar83;
          auVar278._4_4_ = (uint)fVar325 & uVar84;
          auVar278._8_4_ = (uint)fVar327 & uVar85;
          auVar278._12_4_ = (uint)fVar283 & uVar86;
          auVar268._0_8_ = CONCAT44(~uVar84,~uVar83) & 0x7f8000007f800000;
          auVar268._8_4_ = ~uVar85 & 0x7f800000;
          auVar268._12_4_ = ~uVar86 & 0x7f800000;
          auVar268 = auVar268 | auVar278;
          auVar242._0_4_ = (uint)fVar308 & uVar83;
          auVar242._4_4_ = (uint)fVar309 & uVar84;
          auVar242._8_4_ = (uint)fVar316 & uVar85;
          auVar242._12_4_ = (uint)fVar318 & uVar86;
          auVar152._0_8_ = CONCAT44(~uVar84,~uVar83) & 0xff800000ff800000;
          auVar152._8_4_ = ~uVar85 & 0xff800000;
          auVar152._12_4_ = ~uVar86 & 0xff800000;
          auVar152 = auVar152 | auVar242;
          auVar171._0_8_ = (ulong)local_378 & 0x7fffffff7fffffff;
          auVar171._8_4_ = ABS(fStack_370);
          auVar171._12_4_ = ABS(fStack_36c);
          auVar40._4_4_ = fStack_2d4;
          auVar40._0_4_ = local_2d8;
          auVar40._8_4_ = fStack_2d0;
          auVar40._12_4_ = fStack_2cc;
          auVar90 = maxps(auVar40,auVar171);
          fVar308 = auVar90._0_4_ * 1.9073486e-06;
          fVar309 = auVar90._4_4_ * 1.9073486e-06;
          fVar281 = auVar90._8_4_ * 1.9073486e-06;
          fVar284 = auVar90._12_4_ * 1.9073486e-06;
          auVar243._0_4_ = -(uint)(ABS(fVar164) < fVar308 && bVar22);
          auVar243._4_4_ = -(uint)(ABS(fVar280) < fVar309 && bVar23);
          auVar243._8_4_ = -(uint)(ABS(fVar182) < fVar281 && bVar24);
          auVar243._12_4_ = -(uint)(ABS(fVar293) < fVar284 && bVar25);
          iVar64 = movmskps(iVar64,auVar243);
          if (iVar64 != 0) {
            uVar83 = -(uint)(auVar151._0_4_ <= 0.0);
            uVar84 = -(uint)(auVar151._4_4_ <= 0.0);
            uVar85 = -(uint)(auVar151._8_4_ <= 0.0);
            uVar86 = -(uint)(auVar151._12_4_ <= 0.0);
            auVar291._0_4_ = (uVar83 & 0xff800000 | ~uVar83 & 0x7f800000) & auVar243._0_4_;
            auVar291._4_4_ = (uVar84 & 0xff800000 | ~uVar84 & 0x7f800000) & auVar243._4_4_;
            auVar291._8_4_ = (uVar85 & 0xff800000 | ~uVar85 & 0x7f800000) & auVar243._8_4_;
            auVar291._12_4_ = (uVar86 & 0xff800000 | ~uVar86 & 0x7f800000) & auVar243._12_4_;
            auVar279._0_4_ = ~auVar243._0_4_ & auVar268._0_4_;
            auVar279._4_4_ = ~auVar243._4_4_ & auVar268._4_4_;
            auVar279._8_4_ = ~auVar243._8_4_ & auVar268._8_4_;
            auVar279._12_4_ = ~auVar243._12_4_ & auVar268._12_4_;
            auVar268 = auVar279 | auVar291;
            auVar292._0_4_ = (uVar83 & 0x7f800000 | ~uVar83 & 0xff800000) & auVar243._0_4_;
            auVar292._4_4_ = (uVar84 & 0x7f800000 | ~uVar84 & 0xff800000) & auVar243._4_4_;
            auVar292._8_4_ = (uVar85 & 0x7f800000 | ~uVar85 & 0xff800000) & auVar243._8_4_;
            auVar292._12_4_ = (uVar86 & 0x7f800000 | ~uVar86 & 0xff800000) & auVar243._12_4_;
            auVar245._0_4_ = ~auVar243._0_4_ & auVar152._0_4_;
            auVar245._4_4_ = ~auVar243._4_4_ & auVar152._4_4_;
            auVar245._8_4_ = ~auVar243._8_4_ & auVar152._8_4_;
            auVar245._12_4_ = ~auVar243._12_4_ & auVar152._12_4_;
            auVar152 = auVar245 | auVar292;
            local_388._4_4_ = -(uint)((fVar309 <= ABS(fVar280) || auVar151._4_4_ <= 0.0) && bVar23);
            local_388._0_4_ = -(uint)((fVar308 <= ABS(fVar164) || auVar151._0_4_ <= 0.0) && bVar22);
            local_388._8_4_ = -(uint)((fVar281 <= ABS(fVar182) || auVar151._8_4_ <= 0.0) && bVar24);
            local_388._12_4_ =
                 -(uint)((fVar284 <= ABS(fVar293) || auVar151._12_4_ <= 0.0) && bVar25);
          }
          auVar241._8_4_ = fStack_510 * fVar316 - (fStack_360 * fVar246 + fStack_500);
          auVar241._12_4_ = fStack_50c * fVar318 - (fStack_35c * fVar247 + fStack_4fc);
          auVar259._4_4_ = fStack_514 * fVar325 - ((float)local_368._4_4_ * fVar306 + fStack_504);
          auVar259._0_4_ = local_518 * fVar322 - ((float)local_368._0_4_ * fVar298 + local_508);
          auVar259._8_4_ = fStack_510 * fVar327 - (fStack_360 * fVar307 + fStack_500);
          auVar259._12_4_ = fStack_50c * fVar283 - (fStack_35c * fVar320 + fStack_4fc);
        }
        local_498._4_4_ =
             -(uint)(DAT_01ff1e10._4_4_ <=
                    ABS(auVar241._4_4_ * fStack_514 +
                        fVar261 * fVar181 + fVar239 * (float)local_5b8._4_4_));
        local_498._0_4_ =
             -(uint)((float)DAT_01ff1e10 <=
                    ABS(auVar241._0_4_ * local_518 +
                        fVar260 * fVar181 + fVar237 * (float)local_5b8._4_4_));
        fStack_490 = (float)-(uint)(DAT_01ff1e10._8_4_ <=
                                   ABS(auVar241._8_4_ * fStack_510 +
                                       fVar262 * fVar181 + fVar285 * (float)local_5b8._4_4_));
        fStack_48c = (float)-(uint)(DAT_01ff1e10._12_4_ <=
                                   ABS(auVar241._12_4_ * fStack_50c +
                                       fVar270 * fVar181 + fVar295 * (float)local_5b8._4_4_));
        _local_118 = local_468;
        local_108 = minps(auVar167,auVar268);
        _local_228 = maxps(local_468,auVar152);
        local_218 = auVar167;
        local_398._0_8_ =
             CONCAT44(-(uint)(fVar271 <= local_108._4_4_) & auVar258._4_4_,
                      -(uint)(fVar248 <= local_108._0_4_) & auVar258._0_4_);
        local_398._8_4_ = -(uint)(fVar272 <= local_108._8_4_) & auVar258._8_4_;
        local_398._12_4_ = -(uint)(fVar282 <= local_108._12_4_) & auVar258._12_4_;
        local_3a8._0_8_ =
             CONCAT44(-(uint)(local_228._4_4_ <= auVar167._4_4_) & auVar258._4_4_,
                      -(uint)(local_228._0_4_ <= auVar167._0_4_) & auVar258._0_4_);
        local_3a8._8_4_ = -(uint)(local_228._8_4_ <= auVar167._8_4_) & auVar258._8_4_;
        local_3a8._12_4_ = -(uint)(local_228._12_4_ <= auVar167._12_4_) & auVar258._12_4_;
        auVar190._8_4_ = local_398._8_4_;
        auVar190._0_8_ = local_398._0_8_;
        auVar190._12_4_ = local_398._12_4_;
        auVar153._8_4_ = local_3a8._8_4_;
        auVar153._0_8_ = local_3a8._0_8_;
        auVar153._12_4_ = local_3a8._12_4_;
        iVar64 = movmskps(iVar64,auVar153 | auVar190);
        lVar67 = CONCAT44(uVar77,iVar64);
        if (iVar64 != 0) {
          _local_378 = local_3a8;
          _local_4a8 = _local_228;
          local_3e8 = local_540._0_4_;
          fStack_3e4 = local_540._0_4_;
          fStack_3e0 = local_540._0_4_;
          fStack_3dc = local_540._0_4_;
          local_538._0_4_ =
               -(uint)((int)local_540._0_4_ <
                      ((int)((-(uint)((float)DAT_01ff1e10 <=
                                     ABS((float)local_538._0_4_ * (float)local_5b8._4_4_ +
                                         local_6a8 * fVar181 + auVar259._0_4_ * local_518)) &
                             local_388._0_4_) << 0x1f) >> 0x1f) + 4);
          local_538._4_4_ =
               -(uint)((int)local_540._0_4_ <
                      ((int)((-(uint)(DAT_01ff1e10._4_4_ <=
                                     ABS((float)local_538._4_4_ * (float)local_5b8._4_4_ +
                                         fStack_6a4 * fVar181 + auVar259._4_4_ * fStack_514)) &
                             local_388._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_530 = (float)-(uint)((int)local_540._0_4_ <
                                     ((int)((-(uint)(DAT_01ff1e10._8_4_ <=
                                                    ABS(fStack_530 * (float)local_5b8._4_4_ +
                                                        fStack_6a0 * fVar181 +
                                                        auVar259._8_4_ * fStack_510)) &
                                            local_388._8_4_) << 0x1f) >> 0x1f) + 4);
          fStack_52c = (float)-(uint)((int)local_540._0_4_ <
                                     ((int)((-(uint)(DAT_01ff1e10._12_4_ <=
                                                    ABS(fStack_52c * (float)local_5b8._4_4_ +
                                                        fStack_69c * fVar181 +
                                                        auVar259._12_4_ * fStack_50c)) &
                                            local_388._12_4_) << 0x1f) >> 0x1f) + 4);
          local_398 = ~_local_538 & auVar190;
          iVar64 = movmskps(iVar64,local_398);
          _local_368 = auVar190;
          if (iVar64 != 0) {
            local_478 = local_3c8 + fVar248;
            fStack_474 = fStack_3c4 + fVar271;
            fStack_470 = fStack_3c0 + fVar272;
            fStack_46c = fStack_3bc + fVar282;
            do {
              auVar167 = ~local_398 & _DAT_01feb9f0 | local_398 & local_468;
              auVar191._4_4_ = auVar167._0_4_;
              auVar191._0_4_ = auVar167._4_4_;
              auVar191._8_4_ = auVar167._12_4_;
              auVar191._12_4_ = auVar167._8_4_;
              auVar90 = minps(auVar191,auVar167);
              auVar154._0_8_ = auVar90._8_8_;
              auVar154._8_4_ = auVar90._0_4_;
              auVar154._12_4_ = auVar90._4_4_;
              auVar90 = minps(auVar154,auVar90);
              auVar155._0_8_ =
                   CONCAT44(-(uint)(auVar90._4_4_ == auVar167._4_4_) & local_398._4_4_,
                            -(uint)(auVar90._0_4_ == auVar167._0_4_) & local_398._0_4_);
              auVar155._8_4_ = -(uint)(auVar90._8_4_ == auVar167._8_4_) & local_398._8_4_;
              auVar155._12_4_ = -(uint)(auVar90._12_4_ == auVar167._12_4_) & local_398._12_4_;
              iVar64 = movmskps(iVar64,auVar155);
              auVar117 = local_398;
              if (iVar64 != 0) {
                auVar117._8_4_ = auVar155._8_4_;
                auVar117._0_8_ = auVar155._0_8_;
                auVar117._12_4_ = auVar155._12_4_;
              }
              uVar65 = movmskps(iVar64,auVar117);
              lVar67 = 0;
              if (CONCAT44(uVar77,uVar65) != 0) {
                for (; (CONCAT44(uVar77,uVar65) >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                }
              }
              *(undefined4 *)(local_398 + lVar67 * 4) = 0;
              fVar89 = local_328[lVar67];
              fVar130 = *(float *)(local_118 + lVar67 * 4);
              fVar131 = SQRT(fVar236);
              if ((float)local_3d8._0_4_ < 0.0) {
                fVar131 = sqrtf((float)local_3d8._0_4_);
                lVar67 = extraout_RAX;
              }
              auVar29._4_4_ = fVar201;
              auVar29._0_4_ = fVar200;
              auVar29._8_4_ = fVar202;
              auVar29._12_4_ = fVar212;
              auVar33._4_4_ = fStack_4e4;
              auVar33._0_4_ = local_4e8;
              auVar33._8_4_ = fStack_4e0;
              auVar33._12_4_ = fStack_4dc;
              auVar167 = minps(auVar29,auVar33);
              auVar277 = maxps(auVar29,auVar33);
              auVar31._4_4_ = fStack_4f4;
              auVar31._0_4_ = local_4f8;
              auVar31._8_4_ = fStack_4f0;
              auVar31._12_4_ = fStack_4ec;
              auVar90 = minps(auVar31,_local_5d8);
              auVar167 = minps(auVar167,auVar90);
              auVar90 = maxps(auVar31,_local_5d8);
              auVar90 = maxps(auVar277,auVar90);
              auVar206._0_8_ = auVar167._0_8_ & 0x7fffffff7fffffff;
              auVar206._8_4_ = auVar167._8_4_ & 0x7fffffff;
              auVar206._12_4_ = auVar167._12_4_ & 0x7fffffff;
              local_458 = auVar90._12_4_;
              auVar118._0_8_ = auVar90._0_8_ & 0x7fffffff7fffffff;
              auVar118._8_4_ = auVar90._8_4_ & 0x7fffffff;
              auVar118._12_4_ = ABS(local_458);
              auVar90 = maxps(auVar206,auVar118);
              fVar132 = auVar90._4_4_;
              if (auVar90._4_4_ <= auVar90._0_4_) {
                fVar132 = auVar90._0_4_;
              }
              auVar207._8_8_ = auVar90._8_8_;
              auVar207._0_8_ = auVar90._8_8_;
              if (auVar90._8_4_ <= fVar132) {
                auVar207._0_4_ = fVar132;
              }
              fVar132 = auVar207._0_4_ * 1.9073486e-06;
              local_508 = fVar131 * 1.9073486e-06;
              fStack_454 = local_458;
              fStack_450 = local_458;
              fStack_44c = local_458;
              lVar81 = 5;
              do {
                fVar248 = 1.0 - fVar89;
                fVar183 = local_4e8 * fVar248 + local_4f8 * fVar89;
                fVar237 = fStack_4e4 * fVar248 + fStack_4f4 * fVar89;
                fVar246 = fStack_4e0 * fVar248 + fStack_4f0 * fVar89;
                fVar247 = fStack_4dc * fVar248 + fStack_4ec * fVar89;
                fVar131 = (fVar200 * fVar248 + local_4e8 * fVar89) * fVar248 + fVar89 * fVar183;
                fVar133 = (fVar201 * fVar248 + fStack_4e4 * fVar89) * fVar248 + fVar89 * fVar237;
                fVar165 = (fVar202 * fVar248 + fStack_4e0 * fVar89) * fVar248 + fVar89 * fVar246;
                fVar180 = (fVar212 * fVar248 + fStack_4dc * fVar89) * fVar248 + fVar89 * fVar247;
                fVar183 = fVar183 * fVar248 +
                          (local_4f8 * fVar248 + (float)local_5d8._0_4_ * fVar89) * fVar89;
                fVar239 = fVar237 * fVar248 +
                          (fStack_4f4 * fVar248 + (float)local_5d8._4_4_ * fVar89) * fVar89;
                fVar246 = fVar246 * fVar248 + (fStack_4f0 * fVar248 + fStack_5d0 * fVar89) * fVar89;
                fVar247 = fVar247 * fVar248 + (fStack_4ec * fVar248 + fStack_5cc * fVar89) * fVar89;
                local_408 = fVar248 * fVar131 + fVar89 * fVar183;
                fStack_404 = fVar248 * fVar133 + fVar89 * fVar239;
                fStack_400 = fVar248 * fVar165 + fVar89 * fVar246;
                fStack_3fc = fVar248 * fVar180 + fVar89 * fVar247;
                fVar237 = (fVar183 - fVar131) * 3.0;
                fVar239 = (fVar239 - fVar133) * 3.0;
                fVar246 = (fVar246 - fVar165) * 3.0;
                fVar247 = (fVar247 - fVar180) * 3.0;
                fVar133 = (fVar130 * (float)local_3b8._0_4_ + 0.0) - local_408;
                fVar165 = (fVar130 * (float)local_3b8._4_4_ + 0.0) - fStack_404;
                fVar180 = (fVar130 * fStack_3b0 + 0.0) - fStack_400;
                fVar183 = (fVar130 * fStack_3ac + 0.0) - fStack_3fc;
                fVar131 = fVar165 * fVar165;
                fStack_570 = fVar180 * fVar180;
                fStack_56c = fVar183 * fVar183;
                local_578._0_4_ = fVar131 + fVar133 * fVar133 + fStack_570;
                local_578._4_4_ = fVar131 + fVar131 + fStack_56c;
                fStack_570 = fVar131 + fStack_570 + fStack_570;
                fStack_56c = fVar131 + fStack_56c + fStack_56c;
                local_438 = (float)local_578._0_4_;
                if ((float)local_578._0_4_ < 0.0) {
                  fVar131 = sqrtf((float)local_578._0_4_);
                  lVar67 = extraout_RAX_00;
                }
                else {
                  fVar131 = SQRT((float)local_578._0_4_);
                }
                fVar262 = fVar248 * 6.0;
                fVar260 = (fVar89 - (fVar248 + fVar248)) * 6.0;
                fVar261 = (fVar248 - (fVar89 + fVar89)) * 6.0;
                fVar248 = fVar89 * 6.0;
                fVar270 = fVar262 * fVar200 +
                          fVar260 * local_4e8 +
                          fVar261 * local_4f8 + fVar248 * (float)local_5d8._0_4_;
                fVar271 = fVar262 * fVar201 +
                          fVar260 * fStack_4e4 +
                          fVar261 * fStack_4f4 + fVar248 * (float)local_5d8._4_4_;
                fVar260 = fVar262 * fVar202 +
                          fVar260 * fStack_4e0 + fVar261 * fStack_4f0 + fVar248 * fStack_5d0;
                fVar248 = fVar132;
                if (fVar132 <= local_508 * fVar130) {
                  fVar248 = local_508 * fVar130;
                }
                fVar261 = fVar239 * fVar239 + fVar237 * fVar237 + fVar246 * fVar246;
                auVar167 = ZEXT416((uint)fVar261);
                auVar90 = rsqrtss(ZEXT416((uint)fVar261),auVar167);
                fVar262 = auVar90._0_4_;
                fVar262 = fVar262 * fVar262 * fVar261 * -0.5 * fVar262 + fVar262 * 1.5;
                fVar164 = fVar246 * fVar260 + fVar239 * fVar271 + fVar237 * fVar270;
                auVar90 = rcpss(auVar167,auVar167);
                fVar285 = (2.0 - fVar261 * auVar90._0_4_) * auVar90._0_4_;
                fVar272 = fVar237 * fVar262;
                fVar280 = fVar239 * fVar262;
                fVar282 = fVar246 * fVar262;
                fVar182 = fVar247 * fVar262;
                if (fVar261 < 0.0) {
                  fVar293 = sqrtf(fVar261);
                  lVar67 = extraout_RAX_01;
                }
                else {
                  fVar293 = SQRT(fVar261);
                }
                fVar295 = fVar165 * fVar280;
                fVar298 = fVar180 * fVar282;
                fVar306 = fVar183 * fVar182;
                fVar307 = fVar295 + fVar133 * fVar272 + fVar298;
                fVar308 = fVar295 + fVar295 + fVar306;
                fVar298 = fVar295 + fVar298 + fVar298;
                fVar306 = fVar295 + fVar306 + fVar306;
                fVar293 = (fVar131 + 1.0) * (fVar132 / fVar293) + fVar131 * fVar132 + fVar248;
                fVar260 = fVar282 * -fVar246 + fVar280 * -fVar239 + fVar272 * -fVar237 +
                          fVar285 * (fVar261 * fVar260 - fVar164 * fVar246) * fVar262 * fVar180 +
                          fVar285 * (fVar261 * fVar271 - fVar164 * fVar239) * fVar262 * fVar165 +
                          fVar285 * (fVar261 * fVar270 - fVar164 * fVar237) * fVar262 * fVar133;
                local_418 = fStack_3b0 * fVar282 +
                            (float)local_3b8._4_4_ * fVar280 + (float)local_3b8._0_4_ * fVar272;
                fVar131 = (float)local_578._0_4_ - fVar307 * fVar307;
                auVar119._0_8_ = CONCAT44((float)local_578._4_4_ - fVar308 * fVar308,fVar131);
                auVar119._8_4_ = fStack_570 - fVar298 * fVar298;
                auVar119._12_4_ = fStack_56c - fVar306 * fVar306;
                fVar261 = -fVar247 * fVar183;
                fStack_414 = fStack_3ac * fVar182;
                fStack_410 = fStack_3b0 * fVar282;
                fStack_40c = fStack_3ac * fVar182;
                local_428 = (fStack_3b0 * fVar180 +
                            (float)local_3b8._4_4_ * fVar165 + (float)local_3b8._0_4_ * fVar133) -
                            fVar307 * local_418;
                fStack_424 = fStack_3ac * fVar183;
                fStack_420 = fStack_3b0 * fVar180;
                fStack_41c = fStack_3ac * fVar183;
                auVar192._8_4_ = auVar119._8_4_;
                auVar192._0_8_ = auVar119._0_8_;
                auVar192._12_4_ = auVar119._12_4_;
                auVar90 = rsqrtss(auVar192,auVar119);
                fVar183 = auVar90._0_4_;
                auVar193._4_12_ = auVar90._4_12_;
                auVar193._0_4_ = fVar183 * fVar183 * fVar131 * -0.5 * fVar183 + fVar183 * 1.5;
                if (fVar131 < 0.0) {
                  _local_448 = auVar193;
                  fVar131 = sqrtf(fVar131);
                  lVar67 = extraout_RAX_02;
                  auVar193 = _local_448;
                }
                else {
                  fVar131 = SQRT(fVar131);
                }
                fVar131 = fVar131 - fStack_3fc;
                fVar183 = ((-fVar246 * fVar180 + -fVar239 * fVar165 + -fVar237 * fVar133) -
                          fVar307 * fVar260) * auVar193._0_4_ - fVar247;
                auVar35._4_4_ = fStack_424;
                auVar35._0_4_ = local_428;
                auVar35._8_4_ = fStack_420;
                auVar35._12_4_ = fStack_41c;
                auVar172._4_12_ = auVar35._4_12_;
                auVar172._0_4_ = local_428 * auVar193._0_4_;
                auVar335._8_4_ = -fVar261;
                auVar335._0_8_ = CONCAT44(fVar261,fVar183) ^ 0x8000000000000000;
                auVar335._12_4_ = fVar182 * -fVar247;
                auVar334._8_8_ = auVar335._8_8_;
                auVar334._0_8_ = CONCAT44(fVar260,fVar183) ^ 0x80000000;
                auVar194._0_4_ = fVar260 * auVar172._0_4_ - local_418 * fVar183;
                auVar174._0_8_ = auVar172._0_8_;
                auVar174._8_4_ = fStack_424;
                auVar174._12_4_ = -fStack_414;
                auVar173._8_8_ = auVar174._8_8_;
                auVar173._0_8_ = CONCAT44(local_418,auVar172._0_4_) ^ 0x8000000000000000;
                auVar194._4_4_ = auVar194._0_4_;
                auVar194._8_4_ = auVar194._0_4_;
                auVar194._12_4_ = auVar194._0_4_;
                auVar90 = divps(auVar173,auVar194);
                auVar167 = divps(auVar334,auVar194);
                fVar89 = fVar89 - (auVar90._4_4_ * fVar131 + auVar90._0_4_ * fVar307);
                fVar130 = fVar130 - (auVar167._4_4_ * fVar131 + auVar167._0_4_ * fVar307);
                lVar67 = CONCAT71((int7)((ulong)lVar67 >> 8),1);
                if ((ABS(fVar307) < fVar293) &&
                   (ABS(fVar131) < local_458 * 1.9073486e-06 + fVar248 + fVar293)) {
                  fVar130 = fVar130 + (float)local_348._0_4_;
                  if ((fVar130 < fVar88) ||
                     (((fVar131 = *(float *)(ray + k * 4 + 0x80), fVar131 < fVar130 ||
                       (fVar89 < 0.0)) || (1.0 < fVar89)))) {
                    uVar75 = 0;
                    lVar67 = 0;
                  }
                  else {
                    auVar90 = rsqrtss(_local_578,_local_578);
                    fVar183 = auVar90._0_4_;
                    pGVar19 = (context->scene->geometries).items[local_3f0].ptr;
                    if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      lVar67 = 0;
                      uVar75 = 0;
                      pRVar71 = (RTCIntersectArguments *)context;
                    }
                    else {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        uVar75 = 1;
                        pRVar71 = (RTCIntersectArguments *)context;
                      }
                      else {
                        fVar183 = fVar183 * 1.5 + fVar183 * fVar183 * local_438 * -0.5 * fVar183;
                        fVar133 = fVar133 * fVar183;
                        fVar165 = fVar165 * fVar183;
                        fVar180 = fVar180 * fVar183;
                        fVar183 = fVar247 * fVar133 + fVar237;
                        fVar248 = fVar247 * fVar165 + fVar239;
                        fVar247 = fVar247 * fVar180 + fVar246;
                        fVar260 = fVar165 * fVar237 - fVar239 * fVar133;
                        fVar165 = fVar180 * fVar239 - fVar246 * fVar165;
                        fVar133 = fVar133 * fVar246 - fVar237 * fVar180;
                        local_298 = fVar165 * fVar248 - fVar133 * fVar183;
                        local_2b8._4_4_ = fVar133 * fVar247 - fVar260 * fVar248;
                        local_2a8 = fVar260 * fVar183 - fVar165 * fVar247;
                        local_2b8._0_4_ = local_2b8._4_4_;
                        fStack_2b0 = (float)local_2b8._4_4_;
                        fStack_2ac = (float)local_2b8._4_4_;
                        fStack_2a4 = local_2a8;
                        fStack_2a0 = local_2a8;
                        fStack_29c = local_2a8;
                        fStack_294 = local_298;
                        fStack_290 = local_298;
                        fStack_28c = local_298;
                        local_288 = fVar89;
                        fStack_284 = fVar89;
                        fStack_280 = fVar89;
                        fStack_27c = fVar89;
                        local_278 = 0;
                        uStack_270 = 0;
                        local_268 = CONCAT44(uStack_304,local_308);
                        uStack_260 = CONCAT44(uStack_2fc,uStack_300);
                        local_258 = CONCAT44(uStack_2f4,local_2f8);
                        uStack_250 = CONCAT44(uStack_2ec,uStack_2f0);
                        local_248 = context->user->instID[0];
                        uStack_244 = local_248;
                        uStack_240 = local_248;
                        uStack_23c = local_248;
                        local_238 = context->user->instPrimID[0];
                        uStack_234 = local_238;
                        uStack_230 = local_238;
                        uStack_22c = local_238;
                        *(float *)(ray + k * 4 + 0x80) = fVar130;
                        local_558 = *local_3f8;
                        uStack_550 = local_3f8[1];
                        local_4d8 = (undefined1  [8])&local_558;
                        uStack_4d0 = pGVar19->userPtr;
                        local_4c8 = context->user;
                        local_4c0 = ray;
                        local_4b8 = (RTCHitN *)local_2b8;
                        local_4b0 = 4;
                        p_Var69 = pGVar19->occlusionFilterN;
                        pRVar71 = (RTCIntersectArguments *)context;
                        if (p_Var69 != (RTCFilterFunctionN)0x0) {
                          pRVar79 = (RTCFilterFunctionNArguments *)local_4d8;
                          p_Var69 = (RTCFilterFunctionN)(*p_Var69)(pRVar79);
                        }
                        auVar120._0_4_ = -(uint)((int)local_558 == 0);
                        auVar120._4_4_ = -(uint)(local_558._4_4_ == 0);
                        auVar120._8_4_ = -(uint)((int)uStack_550 == 0);
                        auVar120._12_4_ = -(uint)(uStack_550._4_4_ == 0);
                        uVar83 = movmskps((int)p_Var69,auVar120);
                        pRVar68 = (RayK<4> *)(ulong)(uVar83 ^ 0xf);
                        if ((uVar83 ^ 0xf) == 0) {
                          auVar120 = auVar120 ^ _DAT_01febe20;
                        }
                        else {
                          pRVar71 = context->args;
                          if (((RTCIntersectArguments *)pRVar71->filter !=
                               (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar71->flags & 2) != 0 ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar79 = (RTCFilterFunctionNArguments *)local_4d8;
                            (*(code *)pRVar71->filter)();
                          }
                          auVar156._0_4_ = -(uint)((int)local_558 == 0);
                          auVar156._4_4_ = -(uint)(local_558._4_4_ == 0);
                          auVar156._8_4_ = -(uint)((int)uStack_550 == 0);
                          auVar156._12_4_ = -(uint)(uStack_550._4_4_ == 0);
                          auVar120 = auVar156 ^ _DAT_01febe20;
                          *(undefined1 (*) [16])(local_4c0 + 0x80) =
                               ~auVar156 & _DAT_01feba00 |
                               *(undefined1 (*) [16])(local_4c0 + 0x80) & auVar156;
                          pRVar68 = local_4c0;
                        }
                        auVar121._0_4_ = auVar120._0_4_ << 0x1f;
                        auVar121._4_4_ = auVar120._4_4_ << 0x1f;
                        auVar121._8_4_ = auVar120._8_4_ << 0x1f;
                        auVar121._12_4_ = auVar120._12_4_ << 0x1f;
                        iVar64 = movmskps((int)pRVar68,auVar121);
                        uVar75 = (ulong)(iVar64 != 0);
                        if (iVar64 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar131;
                        }
                      }
                      lVar67 = 0;
                    }
                  }
                }
                bVar74 = (byte)uVar75;
                if ((char)lVar67 == '\0') goto LAB_00bc259b;
                lVar81 = lVar81 + -1;
              } while (lVar81 != 0);
              bVar74 = 0;
LAB_00bc259b:
              uVar75 = (ulong)(bVar74 & 1);
              fVar89 = *(float *)(ray + k * 4 + 0x80);
              local_398._0_4_ = -(uint)(local_478 <= fVar89) & local_398._0_4_;
              local_398._4_4_ = -(uint)(fStack_474 <= fVar89) & local_398._4_4_;
              local_398._8_4_ = -(uint)(fStack_470 <= fVar89) & local_398._8_4_;
              local_398._12_4_ = -(uint)(fStack_46c <= fVar89) & local_398._12_4_;
              bVar80 = bVar80 | bVar74 & 1;
              uVar77 = (undefined4)((ulong)lVar67 >> 0x20);
              iVar64 = movmskps((int)lVar67,local_398);
            } while (iVar64 != 0);
          }
          fVar89 = *(float *)(ray + k * 4 + 0x80);
          local_4a8._0_4_ = -(uint)((float)local_4a8._0_4_ + local_3c8 <= fVar89) & local_378._0_4_;
          local_4a8._4_4_ = -(uint)((float)local_4a8._4_4_ + fStack_3c4 <= fVar89) & local_378._4_4_
          ;
          fStack_4a0 = (float)(-(uint)(fStack_4a0 + fStack_3c0 <= fVar89) & (uint)fStack_370);
          fStack_49c = (float)(-(uint)(fStack_49c + fStack_3bc <= fVar89) & (uint)fStack_36c);
          local_498._0_4_ =
               -(uint)((int)local_3e8 <
                      ((int)((local_498._0_4_ & local_388._0_4_) << 0x1f) >> 0x1f) + 4);
          local_498._4_4_ =
               -(uint)((int)fStack_3e4 <
                      ((int)((local_498._4_4_ & local_388._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_490 = (float)-(uint)((int)fStack_3e0 <
                                     ((int)(((uint)fStack_490 & local_388._8_4_) << 0x1f) >> 0x1f) +
                                     4);
          fStack_48c = (float)-(uint)((int)fStack_3dc <
                                     ((int)(((uint)fStack_48c & local_388._12_4_) << 0x1f) >> 0x1f)
                                     + 4);
          local_3a8 = ~_local_498 & _local_4a8;
          iVar64 = movmskps(0,local_3a8);
          if (iVar64 != 0) {
            local_468 = _local_228;
            local_478 = local_3c8 + (float)local_228._0_4_;
            fStack_474 = fStack_3c4 + (float)local_228._4_4_;
            fStack_470 = fStack_3c0 + fStack_220;
            fStack_46c = fStack_3bc + fStack_21c;
            do {
              auVar167 = ~local_3a8 & _DAT_01feb9f0 | local_3a8 & local_468;
              auVar195._4_4_ = auVar167._0_4_;
              auVar195._0_4_ = auVar167._4_4_;
              auVar195._8_4_ = auVar167._12_4_;
              auVar195._12_4_ = auVar167._8_4_;
              auVar90 = minps(auVar195,auVar167);
              auVar157._0_8_ = auVar90._8_8_;
              auVar157._8_4_ = auVar90._0_4_;
              auVar157._12_4_ = auVar90._4_4_;
              auVar90 = minps(auVar157,auVar90);
              auVar158._0_8_ =
                   CONCAT44(-(uint)(auVar90._4_4_ == auVar167._4_4_) & local_3a8._4_4_,
                            -(uint)(auVar90._0_4_ == auVar167._0_4_) & local_3a8._0_4_);
              auVar158._8_4_ = -(uint)(auVar90._8_4_ == auVar167._8_4_) & local_3a8._8_4_;
              auVar158._12_4_ = -(uint)(auVar90._12_4_ == auVar167._12_4_) & local_3a8._12_4_;
              iVar64 = movmskps(iVar64,auVar158);
              auVar122 = local_3a8;
              if (iVar64 != 0) {
                auVar122._8_4_ = auVar158._8_4_;
                auVar122._0_8_ = auVar158._0_8_;
                auVar122._12_4_ = auVar158._12_4_;
              }
              uVar65 = movmskps(iVar64,auVar122);
              lVar67 = 0;
              if (CONCAT44(uVar77,uVar65) != 0) {
                for (; (CONCAT44(uVar77,uVar65) >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                }
              }
              *(undefined4 *)(local_3a8 + lVar67 * 4) = 0;
              fVar89 = local_338[lVar67];
              fVar130 = *(float *)(local_218 + lVar67 * 4);
              fVar131 = SQRT(fVar236);
              if ((float)local_3d8._0_4_ < 0.0) {
                fVar131 = sqrtf((float)local_3d8._0_4_);
                lVar67 = extraout_RAX_03;
              }
              auVar30._4_4_ = fVar201;
              auVar30._0_4_ = fVar200;
              auVar30._8_4_ = fVar202;
              auVar30._12_4_ = fVar212;
              auVar34._4_4_ = fStack_4e4;
              auVar34._0_4_ = local_4e8;
              auVar34._8_4_ = fStack_4e0;
              auVar34._12_4_ = fStack_4dc;
              auVar167 = minps(auVar30,auVar34);
              auVar277 = maxps(auVar30,auVar34);
              auVar32._4_4_ = fStack_4f4;
              auVar32._0_4_ = local_4f8;
              auVar32._8_4_ = fStack_4f0;
              auVar32._12_4_ = fStack_4ec;
              auVar90 = minps(auVar32,_local_5d8);
              auVar167 = minps(auVar167,auVar90);
              auVar90 = maxps(auVar32,_local_5d8);
              auVar90 = maxps(auVar277,auVar90);
              auVar208._0_8_ = auVar167._0_8_ & 0x7fffffff7fffffff;
              auVar208._8_4_ = auVar167._8_4_ & 0x7fffffff;
              auVar208._12_4_ = auVar167._12_4_ & 0x7fffffff;
              local_458 = auVar90._12_4_;
              auVar123._0_8_ = auVar90._0_8_ & 0x7fffffff7fffffff;
              auVar123._8_4_ = auVar90._8_4_ & 0x7fffffff;
              auVar123._12_4_ = ABS(local_458);
              auVar90 = maxps(auVar208,auVar123);
              fVar132 = auVar90._4_4_;
              if (auVar90._4_4_ <= auVar90._0_4_) {
                fVar132 = auVar90._0_4_;
              }
              auVar209._8_8_ = auVar90._8_8_;
              auVar209._0_8_ = auVar90._8_8_;
              if (auVar90._8_4_ <= fVar132) {
                auVar209._0_4_ = fVar132;
              }
              fVar132 = auVar209._0_4_ * 1.9073486e-06;
              local_508 = fVar131 * 1.9073486e-06;
              fStack_454 = local_458;
              fStack_450 = local_458;
              fStack_44c = local_458;
              lVar81 = 5;
              do {
                fVar248 = 1.0 - fVar89;
                fVar183 = local_4e8 * fVar248 + local_4f8 * fVar89;
                fVar237 = fStack_4e4 * fVar248 + fStack_4f4 * fVar89;
                fVar246 = fStack_4e0 * fVar248 + fStack_4f0 * fVar89;
                fVar247 = fStack_4dc * fVar248 + fStack_4ec * fVar89;
                fVar131 = (fVar200 * fVar248 + local_4e8 * fVar89) * fVar248 + fVar89 * fVar183;
                fVar133 = (fVar201 * fVar248 + fStack_4e4 * fVar89) * fVar248 + fVar89 * fVar237;
                fVar165 = (fVar202 * fVar248 + fStack_4e0 * fVar89) * fVar248 + fVar89 * fVar246;
                fVar180 = (fVar212 * fVar248 + fStack_4dc * fVar89) * fVar248 + fVar89 * fVar247;
                fVar183 = fVar183 * fVar248 +
                          (local_4f8 * fVar248 + (float)local_5d8._0_4_ * fVar89) * fVar89;
                fVar239 = fVar237 * fVar248 +
                          (fStack_4f4 * fVar248 + (float)local_5d8._4_4_ * fVar89) * fVar89;
                fVar246 = fVar246 * fVar248 + (fStack_4f0 * fVar248 + fStack_5d0 * fVar89) * fVar89;
                fVar247 = fVar247 * fVar248 + (fStack_4ec * fVar248 + fStack_5cc * fVar89) * fVar89;
                local_408 = fVar248 * fVar131 + fVar89 * fVar183;
                fStack_404 = fVar248 * fVar133 + fVar89 * fVar239;
                fStack_400 = fVar248 * fVar165 + fVar89 * fVar246;
                fStack_3fc = fVar248 * fVar180 + fVar89 * fVar247;
                fVar237 = (fVar183 - fVar131) * 3.0;
                fVar239 = (fVar239 - fVar133) * 3.0;
                fVar246 = (fVar246 - fVar165) * 3.0;
                fVar247 = (fVar247 - fVar180) * 3.0;
                fVar133 = (fVar130 * (float)local_3b8._0_4_ + 0.0) - local_408;
                fVar165 = (fVar130 * (float)local_3b8._4_4_ + 0.0) - fStack_404;
                fVar180 = (fVar130 * fStack_3b0 + 0.0) - fStack_400;
                fVar183 = (fVar130 * fStack_3ac + 0.0) - fStack_3fc;
                fVar131 = fVar165 * fVar165;
                fStack_570 = fVar180 * fVar180;
                fStack_56c = fVar183 * fVar183;
                local_578._0_4_ = fVar131 + fVar133 * fVar133 + fStack_570;
                local_578._4_4_ = fVar131 + fVar131 + fStack_56c;
                fStack_570 = fVar131 + fStack_570 + fStack_570;
                fStack_56c = fVar131 + fStack_56c + fStack_56c;
                local_438 = (float)local_578._0_4_;
                if ((float)local_578._0_4_ < 0.0) {
                  fVar131 = sqrtf((float)local_578._0_4_);
                  lVar67 = extraout_RAX_04;
                }
                else {
                  fVar131 = SQRT((float)local_578._0_4_);
                }
                fVar262 = fVar248 * 6.0;
                fVar260 = (fVar89 - (fVar248 + fVar248)) * 6.0;
                fVar261 = (fVar248 - (fVar89 + fVar89)) * 6.0;
                fVar248 = fVar89 * 6.0;
                fVar270 = fVar262 * fVar200 +
                          fVar260 * local_4e8 +
                          fVar261 * local_4f8 + fVar248 * (float)local_5d8._0_4_;
                fVar271 = fVar262 * fVar201 +
                          fVar260 * fStack_4e4 +
                          fVar261 * fStack_4f4 + fVar248 * (float)local_5d8._4_4_;
                fVar260 = fVar262 * fVar202 +
                          fVar260 * fStack_4e0 + fVar261 * fStack_4f0 + fVar248 * fStack_5d0;
                fVar248 = fVar132;
                if (fVar132 <= local_508 * fVar130) {
                  fVar248 = local_508 * fVar130;
                }
                fVar261 = fVar239 * fVar239 + fVar237 * fVar237 + fVar246 * fVar246;
                auVar167 = ZEXT416((uint)fVar261);
                auVar90 = rsqrtss(ZEXT416((uint)fVar261),auVar167);
                fVar262 = auVar90._0_4_;
                fVar262 = fVar262 * fVar262 * fVar261 * -0.5 * fVar262 + fVar262 * 1.5;
                fVar164 = fVar246 * fVar260 + fVar239 * fVar271 + fVar237 * fVar270;
                auVar90 = rcpss(auVar167,auVar167);
                fVar285 = (2.0 - fVar261 * auVar90._0_4_) * auVar90._0_4_;
                fVar272 = fVar237 * fVar262;
                fVar280 = fVar239 * fVar262;
                fVar282 = fVar246 * fVar262;
                fVar182 = fVar247 * fVar262;
                if (fVar261 < 0.0) {
                  fVar293 = sqrtf(fVar261);
                  lVar67 = extraout_RAX_05;
                }
                else {
                  fVar293 = SQRT(fVar261);
                }
                fVar295 = fVar165 * fVar280;
                fVar298 = fVar180 * fVar282;
                fVar306 = fVar183 * fVar182;
                fVar307 = fVar295 + fVar133 * fVar272 + fVar298;
                fVar308 = fVar295 + fVar295 + fVar306;
                fVar298 = fVar295 + fVar298 + fVar298;
                fVar306 = fVar295 + fVar306 + fVar306;
                fVar293 = (fVar131 + 1.0) * (fVar132 / fVar293) + fVar131 * fVar132 + fVar248;
                fVar260 = fVar282 * -fVar246 + fVar280 * -fVar239 + fVar272 * -fVar237 +
                          fVar285 * (fVar261 * fVar260 - fVar164 * fVar246) * fVar262 * fVar180 +
                          fVar285 * (fVar261 * fVar271 - fVar164 * fVar239) * fVar262 * fVar165 +
                          fVar285 * (fVar261 * fVar270 - fVar164 * fVar237) * fVar262 * fVar133;
                local_418 = fStack_3b0 * fVar282 +
                            (float)local_3b8._4_4_ * fVar280 + (float)local_3b8._0_4_ * fVar272;
                fVar131 = (float)local_578._0_4_ - fVar307 * fVar307;
                auVar124._0_8_ = CONCAT44((float)local_578._4_4_ - fVar308 * fVar308,fVar131);
                auVar124._8_4_ = fStack_570 - fVar298 * fVar298;
                auVar124._12_4_ = fStack_56c - fVar306 * fVar306;
                fVar261 = -fVar247 * fVar183;
                fStack_414 = fStack_3ac * fVar182;
                fStack_410 = fStack_3b0 * fVar282;
                fStack_40c = fStack_3ac * fVar182;
                local_428 = (fStack_3b0 * fVar180 +
                            (float)local_3b8._4_4_ * fVar165 + (float)local_3b8._0_4_ * fVar133) -
                            fVar307 * local_418;
                fStack_424 = fStack_3ac * fVar183;
                fStack_420 = fStack_3b0 * fVar180;
                fStack_41c = fStack_3ac * fVar183;
                auVar196._8_4_ = auVar124._8_4_;
                auVar196._0_8_ = auVar124._0_8_;
                auVar196._12_4_ = auVar124._12_4_;
                auVar90 = rsqrtss(auVar196,auVar124);
                fVar183 = auVar90._0_4_;
                auVar197._4_12_ = auVar90._4_12_;
                auVar197._0_4_ = fVar183 * fVar183 * fVar131 * -0.5 * fVar183 + fVar183 * 1.5;
                if (fVar131 < 0.0) {
                  _local_448 = auVar197;
                  fVar131 = sqrtf(fVar131);
                  lVar67 = extraout_RAX_06;
                  auVar197 = _local_448;
                }
                else {
                  fVar131 = SQRT(fVar131);
                }
                fVar131 = fVar131 - fStack_3fc;
                fVar183 = ((-fVar246 * fVar180 + -fVar239 * fVar165 + -fVar237 * fVar133) -
                          fVar307 * fVar260) * auVar197._0_4_ - fVar247;
                auVar36._4_4_ = fStack_424;
                auVar36._0_4_ = local_428;
                auVar36._8_4_ = fStack_420;
                auVar36._12_4_ = fStack_41c;
                auVar175._4_12_ = auVar36._4_12_;
                auVar175._0_4_ = local_428 * auVar197._0_4_;
                auVar337._8_4_ = -fVar261;
                auVar337._0_8_ = CONCAT44(fVar261,fVar183) ^ 0x8000000000000000;
                auVar337._12_4_ = fVar182 * -fVar247;
                auVar336._8_8_ = auVar337._8_8_;
                auVar336._0_8_ = CONCAT44(fVar260,fVar183) ^ 0x80000000;
                auVar198._0_4_ = fVar260 * auVar175._0_4_ - local_418 * fVar183;
                auVar177._0_8_ = auVar175._0_8_;
                auVar177._8_4_ = fStack_424;
                auVar177._12_4_ = -fStack_414;
                auVar176._8_8_ = auVar177._8_8_;
                auVar176._0_8_ = CONCAT44(local_418,auVar175._0_4_) ^ 0x8000000000000000;
                auVar198._4_4_ = auVar198._0_4_;
                auVar198._8_4_ = auVar198._0_4_;
                auVar198._12_4_ = auVar198._0_4_;
                auVar90 = divps(auVar176,auVar198);
                auVar167 = divps(auVar336,auVar198);
                fVar89 = fVar89 - (auVar90._4_4_ * fVar131 + auVar90._0_4_ * fVar307);
                fVar130 = fVar130 - (auVar167._4_4_ * fVar131 + auVar167._0_4_ * fVar307);
                lVar67 = CONCAT71((int7)((ulong)lVar67 >> 8),1);
                if ((ABS(fVar307) < fVar293) &&
                   (ABS(fVar131) < local_458 * 1.9073486e-06 + fVar248 + fVar293)) {
                  fVar130 = fVar130 + (float)local_348._0_4_;
                  if ((fVar88 <= fVar130) &&
                     (((fVar131 = *(float *)(ray + k * 4 + 0x80), fVar130 <= fVar131 &&
                       (0.0 <= fVar89)) && (fVar89 <= 1.0)))) {
                    auVar90 = rsqrtss(_local_578,_local_578);
                    fVar183 = auVar90._0_4_;
                    pGVar19 = (context->scene->geometries).items[local_3f0].ptr;
                    pRVar71 = (RTCIntersectArguments *)context;
                    if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        uVar75 = 1;
                      }
                      else {
                        fVar183 = fVar183 * 1.5 + fVar183 * fVar183 * local_438 * -0.5 * fVar183;
                        fVar133 = fVar133 * fVar183;
                        fVar165 = fVar165 * fVar183;
                        fVar180 = fVar180 * fVar183;
                        fVar183 = fVar247 * fVar133 + fVar237;
                        fVar248 = fVar247 * fVar165 + fVar239;
                        fVar247 = fVar247 * fVar180 + fVar246;
                        fVar260 = fVar165 * fVar237 - fVar239 * fVar133;
                        fVar165 = fVar180 * fVar239 - fVar246 * fVar165;
                        fVar133 = fVar133 * fVar246 - fVar237 * fVar180;
                        local_298 = fVar165 * fVar248 - fVar133 * fVar183;
                        local_2b8._4_4_ = fVar133 * fVar247 - fVar260 * fVar248;
                        local_2a8 = fVar260 * fVar183 - fVar165 * fVar247;
                        local_2b8._0_4_ = local_2b8._4_4_;
                        fStack_2b0 = (float)local_2b8._4_4_;
                        fStack_2ac = (float)local_2b8._4_4_;
                        fStack_2a4 = local_2a8;
                        fStack_2a0 = local_2a8;
                        fStack_29c = local_2a8;
                        fStack_294 = local_298;
                        fStack_290 = local_298;
                        fStack_28c = local_298;
                        local_288 = fVar89;
                        fStack_284 = fVar89;
                        fStack_280 = fVar89;
                        fStack_27c = fVar89;
                        local_278 = 0;
                        uStack_270 = 0;
                        local_268 = CONCAT44(uStack_304,local_308);
                        uStack_260 = CONCAT44(uStack_2fc,uStack_300);
                        local_258 = CONCAT44(uStack_2f4,local_2f8);
                        uStack_250 = CONCAT44(uStack_2ec,uStack_2f0);
                        local_248 = context->user->instID[0];
                        uStack_244 = local_248;
                        uStack_240 = local_248;
                        uStack_23c = local_248;
                        local_238 = context->user->instPrimID[0];
                        uStack_234 = local_238;
                        uStack_230 = local_238;
                        uStack_22c = local_238;
                        *(float *)(ray + k * 4 + 0x80) = fVar130;
                        local_558 = *local_3f8;
                        uStack_550 = local_3f8[1];
                        local_4d8 = (undefined1  [8])&local_558;
                        uStack_4d0 = pGVar19->userPtr;
                        local_4c8 = context->user;
                        local_4c0 = ray;
                        local_4b8 = (RTCHitN *)local_2b8;
                        local_4b0 = 4;
                        p_Var69 = pGVar19->occlusionFilterN;
                        if (p_Var69 != (RTCFilterFunctionN)0x0) {
                          pRVar79 = (RTCFilterFunctionNArguments *)local_4d8;
                          p_Var69 = (RTCFilterFunctionN)(*p_Var69)(pRVar79);
                        }
                        auVar125._0_4_ = -(uint)((int)local_558 == 0);
                        auVar125._4_4_ = -(uint)(local_558._4_4_ == 0);
                        auVar125._8_4_ = -(uint)((int)uStack_550 == 0);
                        auVar125._12_4_ = -(uint)(uStack_550._4_4_ == 0);
                        uVar83 = movmskps((int)p_Var69,auVar125);
                        pRVar68 = (RayK<4> *)(ulong)(uVar83 ^ 0xf);
                        if ((uVar83 ^ 0xf) == 0) {
                          auVar125 = auVar125 ^ _DAT_01febe20;
                        }
                        else {
                          pRVar71 = context->args;
                          if (((RTCIntersectArguments *)pRVar71->filter !=
                               (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar71->flags & 2) != 0 ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar79 = (RTCFilterFunctionNArguments *)local_4d8;
                            (*(code *)pRVar71->filter)();
                          }
                          auVar159._0_4_ = -(uint)((int)local_558 == 0);
                          auVar159._4_4_ = -(uint)(local_558._4_4_ == 0);
                          auVar159._8_4_ = -(uint)((int)uStack_550 == 0);
                          auVar159._12_4_ = -(uint)(uStack_550._4_4_ == 0);
                          auVar125 = auVar159 ^ _DAT_01febe20;
                          *(undefined1 (*) [16])(local_4c0 + 0x80) =
                               ~auVar159 & _DAT_01feba00 |
                               *(undefined1 (*) [16])(local_4c0 + 0x80) & auVar159;
                          pRVar68 = local_4c0;
                        }
                        auVar126._0_4_ = auVar125._0_4_ << 0x1f;
                        auVar126._4_4_ = auVar125._4_4_ << 0x1f;
                        auVar126._8_4_ = auVar125._8_4_ << 0x1f;
                        auVar126._12_4_ = auVar125._12_4_ << 0x1f;
                        iVar64 = movmskps((int)pRVar68,auVar126);
                        uVar75 = (ulong)(iVar64 != 0);
                        if (iVar64 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar131;
                        }
                      }
                      lVar67 = 0;
                      goto LAB_00bc2d7c;
                    }
                  }
                  lVar67 = 0;
                  uVar75 = 0;
                }
LAB_00bc2d7c:
                bVar74 = (byte)uVar75;
                if ((char)lVar67 == '\0') goto LAB_00bc30ca;
                lVar81 = lVar81 + -1;
              } while (lVar81 != 0);
              bVar74 = 0;
LAB_00bc30ca:
              uVar75 = (ulong)(bVar74 & 1);
              fVar89 = *(float *)(ray + k * 4 + 0x80);
              local_3a8._0_4_ = -(uint)(local_478 <= fVar89) & local_3a8._0_4_;
              local_3a8._4_4_ = -(uint)(fStack_474 <= fVar89) & local_3a8._4_4_;
              local_3a8._8_4_ = -(uint)(fStack_470 <= fVar89) & local_3a8._8_4_;
              local_3a8._12_4_ = -(uint)(fStack_46c <= fVar89) & local_3a8._12_4_;
              bVar80 = bVar80 | bVar74 & 1;
              uVar77 = (undefined4)((ulong)lVar67 >> 0x20);
              iVar64 = movmskps((int)lVar67,local_3a8);
            } while (iVar64 != 0);
          }
          fVar89 = *(float *)(ray + k * 4 + 0x80);
          auVar244._0_4_ =
               local_538._0_4_ & local_368._0_4_ &
               -(uint)(local_3c8 + (float)local_118._0_4_ <= fVar89);
          auVar244._4_4_ =
               local_538._4_4_ & local_368._4_4_ &
               -(uint)(fStack_3c4 + (float)local_118._4_4_ <= fVar89);
          auVar244._8_4_ =
               (uint)fStack_530 & (uint)fStack_360 & -(uint)(fStack_3c0 + fStack_110 <= fVar89);
          auVar244._12_4_ =
               (uint)fStack_52c & (uint)fStack_35c & -(uint)(fStack_3bc + fStack_10c <= fVar89);
          auVar178._0_4_ =
               local_498._0_4_ & local_4a8._0_4_ &
               -(uint)(local_3c8 + (float)local_228._0_4_ <= fVar89);
          auVar178._4_4_ =
               local_498._4_4_ & local_4a8._4_4_ &
               -(uint)(fStack_3c4 + (float)local_228._4_4_ <= fVar89);
          auVar178._8_4_ =
               (uint)fStack_490 & (uint)fStack_4a0 & -(uint)(fStack_3c0 + fStack_220 <= fVar89);
          auVar178._12_4_ =
               (uint)fStack_48c & (uint)fStack_49c & -(uint)(fStack_3bc + fStack_21c <= fVar89);
          iVar64 = movmskps(0,auVar178 | auVar244);
          lVar67 = CONCAT44(uVar77,iVar64);
          fVar132 = local_488;
          fVar89 = fStack_484;
          fVar130 = fStack_480;
          fVar131 = fStack_47c;
          fVar183 = local_528;
          fVar133 = fStack_524;
          fVar165 = fStack_520;
          fVar180 = fStack_51c;
          if (iVar64 != 0) {
            uVar70 = (ulong)uVar82;
            lVar67 = uVar70 * 0x30;
            *(undefined1 (*) [16])(local_f8 + uVar70 * 0xc) = auVar178 | auVar244;
            afStack_e8[uVar70 * 0xc] =
                 (float)(~auVar244._0_4_ & local_228._0_4_ | local_118._0_4_ & auVar244._0_4_);
            afStack_e8[uVar70 * 0xc + 1] =
                 (float)(~auVar244._4_4_ & local_228._4_4_ | local_118._4_4_ & auVar244._4_4_);
            afStack_e8[uVar70 * 0xc + 2] =
                 (float)(~auVar244._8_4_ & (uint)fStack_220 | (uint)fStack_110 & auVar244._8_4_);
            afStack_e8[uVar70 * 0xc + 3] =
                 (float)(~auVar244._12_4_ & (uint)fStack_21c | (uint)fStack_10c & auVar244._12_4_);
            *(undefined8 *)(local_d8 + uVar70 * 0xc) = local_358;
            fVar237 = (float)((int)local_540 + 1);
            pRVar71 = (RTCIntersectArguments *)(ulong)(uint)fVar237;
            local_d8[uVar70 * 0xc + 2] = fVar237;
            uVar82 = uVar82 + 1;
          }
        }
      }
    }
    do {
      if (uVar82 == 0) {
        if (bVar80 != 0) {
          return local_6a9;
        }
        fVar181 = *(float *)(ray + k * 4 + 0x80);
        auVar163._4_4_ = -(uint)(fStack_204 <= fVar181);
        auVar163._0_4_ = -(uint)(local_208 <= fVar181);
        auVar163._8_4_ = -(uint)(fStack_200 <= fVar181);
        auVar163._12_4_ = -(uint)(fStack_1fc <= fVar181);
        uVar82 = movmskps((int)pRVar71,auVar163);
        uVar82 = (uint)local_310 - 1 & (uint)local_310 & uVar82;
        local_6a9 = uVar82 != 0;
        if (!local_6a9) {
          return local_6a9;
        }
        goto LAB_00bc08e4;
      }
      uVar83 = uVar82 - 1;
      pRVar71 = (RTCIntersectArguments *)(ulong)uVar83;
      fVar237 = *(float *)(ray + k * 4 + 0x80);
      auVar127._0_4_ =
           -(uint)(local_3c8 + afStack_e8[(long)pRVar71 * 0xc] <= fVar237) &
           local_f8[(long)pRVar71 * 0xc];
      auVar127._4_4_ =
           -(uint)(fStack_3c4 + afStack_e8[(long)pRVar71 * 0xc + 1] <= fVar237) &
           local_f8[(long)pRVar71 * 0xc + 1];
      auVar127._8_4_ =
           -(uint)(fStack_3c0 + afStack_e8[(long)pRVar71 * 0xc + 2] <= fVar237) &
           local_f8[(long)pRVar71 * 0xc + 2];
      auVar127._12_4_ =
           -(uint)(fStack_3bc + afStack_e8[(long)pRVar71 * 0xc + 3] <= fVar237) &
           (uint)afStack_e8[(long)pRVar71 * 0xc + -1];
      _local_2b8 = auVar127;
      iVar64 = movmskps((int)lVar67,auVar127);
      lVar67 = CONCAT44((int)((ulong)lVar67 >> 0x20),iVar64);
      if (iVar64 != 0) {
        auVar160._0_4_ = (uint)afStack_e8[(long)pRVar71 * 0xc] & auVar127._0_4_;
        auVar160._4_4_ = (uint)afStack_e8[(long)pRVar71 * 0xc + 1] & auVar127._4_4_;
        auVar160._8_4_ = (uint)afStack_e8[(long)pRVar71 * 0xc + 2] & auVar127._8_4_;
        auVar160._12_4_ = (uint)afStack_e8[(long)pRVar71 * 0xc + 3] & auVar127._12_4_;
        auVar179._0_8_ = CONCAT44(~auVar127._4_4_,~auVar127._0_4_) & 0x7f8000007f800000;
        auVar179._8_4_ = ~auVar127._8_4_ & 0x7f800000;
        auVar179._12_4_ = ~auVar127._12_4_ & 0x7f800000;
        auVar179 = auVar179 | auVar160;
        auVar199._4_4_ = auVar179._0_4_;
        auVar199._0_4_ = auVar179._4_4_;
        auVar199._8_4_ = auVar179._12_4_;
        auVar199._12_4_ = auVar179._8_4_;
        auVar90 = minps(auVar199,auVar179);
        auVar161._0_8_ = auVar90._8_8_;
        auVar161._8_4_ = auVar90._0_4_;
        auVar161._12_4_ = auVar90._4_4_;
        auVar90 = minps(auVar161,auVar90);
        auVar162._0_8_ =
             CONCAT44(-(uint)(auVar90._4_4_ == auVar179._4_4_) & auVar127._4_4_,
                      -(uint)(auVar90._0_4_ == auVar179._0_4_) & auVar127._0_4_);
        auVar162._8_4_ = -(uint)(auVar90._8_4_ == auVar179._8_4_) & auVar127._8_4_;
        auVar162._12_4_ = -(uint)(auVar90._12_4_ == auVar179._12_4_) & auVar127._12_4_;
        iVar76 = movmskps((int)lVar78,auVar162);
        if (iVar76 != 0) {
          auVar127._8_4_ = auVar162._8_4_;
          auVar127._0_8_ = auVar162._0_8_;
          auVar127._12_4_ = auVar162._12_4_;
        }
        fVar237 = local_d8[(long)pRVar71 * 0xc];
        fVar239 = local_d8[(long)pRVar71 * 0xc + 1];
        uVar77 = movmskps(iVar76,auVar127);
        uVar70 = CONCAT44((int)((ulong)lVar78 >> 0x20),uVar77);
        lVar78 = 0;
        if (uVar70 != 0) {
          for (; (uVar70 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
          }
        }
        *(undefined4 *)(local_2b8 + lVar78 * 4) = 0;
        iVar76 = movmskps((int)pRVar79,_local_2b8);
        pRVar79 = (RTCFilterFunctionNArguments *)(ulong)(uint)local_d8[(long)pRVar71 * 0xc + 2];
        if (iVar76 == 0) {
          uVar82 = uVar83;
        }
        *(undefined1 (*) [16])(local_f8 + (long)pRVar71 * 0xc) = _local_2b8;
        fVar239 = fVar239 - fVar237;
        local_4d8._4_4_ = fVar239 * 0.33333334 + fVar237;
        local_4d8._0_4_ = fVar239 * 0.0 + fVar237;
        uStack_4d0 = (void *)CONCAT44(fVar239 * 1.0 + fVar237,fVar239 * 0.6666667 + fVar237);
        local_358 = *(undefined8 *)(local_4d8 + lVar78 * 4);
        uStack_350 = 0;
        uVar83 = uVar82;
        local_540 = pRVar79;
      }
      uVar82 = uVar83;
    } while ((char)iVar64 == '\0');
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }